

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  byte bVar60;
  ulong uVar61;
  bool bVar62;
  Geometry *geometry;
  long lVar63;
  uint uVar64;
  ulong uVar65;
  byte bVar66;
  ulong uVar67;
  float fVar68;
  float fVar69;
  float fVar114;
  float fVar116;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar77 [16];
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar120;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar118;
  float fVar121;
  float fVar122;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined4 uVar123;
  float fVar128;
  float fVar129;
  vint4 bi_2;
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined8 uVar131;
  vint4 bi_1;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  vint4 bi;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar162;
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  LinearSpace3fa *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined8 local_2c0;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar176 [64];
  
  PVar8 = prim[1];
  uVar61 = (ulong)(byte)PVar8;
  fVar139 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar74 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar140._0_4_ = fVar139 * auVar74._0_4_;
  auVar140._4_4_ = fVar139 * auVar74._4_4_;
  auVar140._8_4_ = fVar139 * auVar74._8_4_;
  auVar140._12_4_ = fVar139 * auVar74._12_4_;
  auVar77._0_4_ = fVar139 * auVar72._0_4_;
  auVar77._4_4_ = fVar139 * auVar72._4_4_;
  auVar77._8_4_ = fVar139 * auVar72._8_4_;
  auVar77._12_4_ = fVar139 * auVar72._12_4_;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar61 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar65 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 + uVar61 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar67 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar172._4_4_ = auVar77._0_4_;
  auVar172._0_4_ = auVar77._0_4_;
  auVar172._8_4_ = auVar77._0_4_;
  auVar172._12_4_ = auVar77._0_4_;
  auVar23 = vshufps_avx(auVar77,auVar77,0x55);
  auVar73 = vshufps_avx(auVar77,auVar77,0xaa);
  fVar139 = auVar73._0_4_;
  auVar135._0_4_ = fVar139 * auVar18._0_4_;
  fVar128 = auVar73._4_4_;
  auVar135._4_4_ = fVar128 * auVar18._4_4_;
  fVar129 = auVar73._8_4_;
  auVar135._8_4_ = fVar129 * auVar18._8_4_;
  fVar130 = auVar73._12_4_;
  auVar135._12_4_ = fVar130 * auVar18._12_4_;
  auVar132._0_4_ = auVar20._0_4_ * fVar139;
  auVar132._4_4_ = auVar20._4_4_ * fVar128;
  auVar132._8_4_ = auVar20._8_4_ * fVar129;
  auVar132._12_4_ = auVar20._12_4_ * fVar130;
  auVar124._0_4_ = auVar76._0_4_ * fVar139;
  auVar124._4_4_ = auVar76._4_4_ * fVar128;
  auVar124._8_4_ = auVar76._8_4_ * fVar129;
  auVar124._12_4_ = auVar76._12_4_ * fVar130;
  auVar73 = vfmadd231ps_fma(auVar135,auVar23,auVar72);
  auVar71 = vfmadd231ps_fma(auVar132,auVar23,auVar75);
  auVar23 = vfmadd231ps_fma(auVar124,auVar22,auVar23);
  auVar70 = vfmadd231ps_fma(auVar73,auVar172,auVar74);
  auVar71 = vfmadd231ps_fma(auVar71,auVar172,auVar19);
  auVar77 = vfmadd231ps_fma(auVar23,auVar21,auVar172);
  auVar173._4_4_ = auVar140._0_4_;
  auVar173._0_4_ = auVar140._0_4_;
  auVar173._8_4_ = auVar140._0_4_;
  auVar173._12_4_ = auVar140._0_4_;
  auVar23 = vshufps_avx(auVar140,auVar140,0x55);
  auVar73 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar139 = auVar73._0_4_;
  auVar177._0_4_ = fVar139 * auVar18._0_4_;
  fVar128 = auVar73._4_4_;
  auVar177._4_4_ = fVar128 * auVar18._4_4_;
  fVar129 = auVar73._8_4_;
  auVar177._8_4_ = fVar129 * auVar18._8_4_;
  fVar130 = auVar73._12_4_;
  auVar177._12_4_ = fVar130 * auVar18._12_4_;
  auVar149._0_4_ = auVar20._0_4_ * fVar139;
  auVar149._4_4_ = auVar20._4_4_ * fVar128;
  auVar149._8_4_ = auVar20._8_4_ * fVar129;
  auVar149._12_4_ = auVar20._12_4_ * fVar130;
  auVar141._0_4_ = auVar76._0_4_ * fVar139;
  auVar141._4_4_ = auVar76._4_4_ * fVar128;
  auVar141._8_4_ = auVar76._8_4_ * fVar129;
  auVar141._12_4_ = auVar76._12_4_ * fVar130;
  auVar72 = vfmadd231ps_fma(auVar177,auVar23,auVar72);
  auVar18 = vfmadd231ps_fma(auVar149,auVar23,auVar75);
  auVar75 = vfmadd231ps_fma(auVar141,auVar23,auVar22);
  auVar20 = vfmadd231ps_fma(auVar72,auVar173,auVar74);
  auVar22 = vfmadd231ps_fma(auVar18,auVar173,auVar19);
  auVar163._8_4_ = 0x7fffffff;
  auVar163._0_8_ = 0x7fffffff7fffffff;
  auVar163._12_4_ = 0x7fffffff;
  auVar76 = vfmadd231ps_fma(auVar75,auVar173,auVar21);
  auVar74 = vandps_avx(auVar70,auVar163);
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar74,auVar159,1);
  bVar62 = (bool)((byte)uVar65 & 1);
  auVar73._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._0_4_;
  bVar62 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._4_4_;
  bVar62 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._8_4_;
  bVar62 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar70._12_4_;
  auVar74 = vandps_avx(auVar71,auVar163);
  uVar65 = vcmpps_avx512vl(auVar74,auVar159,1);
  bVar62 = (bool)((byte)uVar65 & 1);
  auVar70._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._0_4_;
  bVar62 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._4_4_;
  bVar62 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._8_4_;
  bVar62 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar71._12_4_;
  auVar74 = vandps_avx(auVar77,auVar163);
  uVar65 = vcmpps_avx512vl(auVar74,auVar159,1);
  bVar62 = (bool)((byte)uVar65 & 1);
  auVar71._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._0_4_;
  bVar62 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._4_4_;
  bVar62 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._8_4_;
  bVar62 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar77._12_4_;
  auVar72 = vrcp14ps_avx512vl(auVar73);
  auVar160._8_4_ = 0x3f800000;
  auVar160._0_8_ = 0x3f8000003f800000;
  auVar160._12_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar73,auVar72,auVar160);
  auVar19 = vfmadd132ps_fma(auVar74,auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar74 = vfnmadd213ps_fma(auVar70,auVar72,auVar160);
  auVar75 = vfmadd132ps_fma(auVar74,auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar71);
  auVar74 = vfnmadd213ps_fma(auVar71,auVar72,auVar160);
  auVar21 = vfmadd132ps_fma(auVar74,auVar72,auVar72);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar20);
  auVar155._0_4_ = auVar19._0_4_ * auVar74._0_4_;
  auVar155._4_4_ = auVar19._4_4_ * auVar74._4_4_;
  auVar155._8_4_ = auVar19._8_4_ * auVar74._8_4_;
  auVar155._12_4_ = auVar19._12_4_ * auVar74._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar72);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar20);
  auVar73 = vpbroadcastd_avx512vl();
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar72 = vpmovsxwd_avx(auVar18);
  auVar136._0_4_ = auVar19._0_4_ * auVar74._0_4_;
  auVar136._4_4_ = auVar19._4_4_ * auVar74._4_4_;
  auVar136._8_4_ = auVar19._8_4_ * auVar74._8_4_;
  auVar136._12_4_ = auVar19._12_4_ * auVar74._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar61 * -2 + 6);
  auVar74 = vpmovsxwd_avx(auVar19);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar22);
  auVar161._0_4_ = auVar75._0_4_ * auVar74._0_4_;
  auVar161._4_4_ = auVar75._4_4_ * auVar74._4_4_;
  auVar161._8_4_ = auVar75._8_4_ * auVar74._8_4_;
  auVar161._12_4_ = auVar75._12_4_ * auVar74._12_4_;
  auVar74 = vcvtdq2ps_avx(auVar72);
  auVar74 = vsubps_avx(auVar74,auVar22);
  auVar133._0_4_ = auVar75._0_4_ * auVar74._0_4_;
  auVar133._4_4_ = auVar75._4_4_ * auVar74._4_4_;
  auVar133._8_4_ = auVar75._8_4_ * auVar74._8_4_;
  auVar133._12_4_ = auVar75._12_4_ * auVar74._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar67 + uVar61 + 6);
  auVar74 = vpmovsxwd_avx(auVar75);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar76);
  auVar150._0_4_ = auVar21._0_4_ * auVar74._0_4_;
  auVar150._4_4_ = auVar21._4_4_ * auVar74._4_4_;
  auVar150._8_4_ = auVar21._8_4_ * auVar74._8_4_;
  auVar150._12_4_ = auVar21._12_4_ * auVar74._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar74 = vpmovsxwd_avx(auVar20);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar76);
  auVar125._0_4_ = auVar21._0_4_ * auVar74._0_4_;
  auVar125._4_4_ = auVar21._4_4_ * auVar74._4_4_;
  auVar125._8_4_ = auVar21._8_4_ * auVar74._8_4_;
  auVar125._12_4_ = auVar21._12_4_ * auVar74._12_4_;
  auVar74 = vpminsd_avx(auVar155,auVar136);
  auVar72 = vpminsd_avx(auVar161,auVar133);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72 = vpminsd_avx(auVar150,auVar125);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar21._4_4_ = uVar123;
  auVar21._0_4_ = uVar123;
  auVar21._8_4_ = uVar123;
  auVar21._12_4_ = uVar123;
  auVar72 = vmaxps_avx512vl(auVar72,auVar21);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_290 = vmulps_avx512vl(auVar74,auVar22);
  auVar74 = vpmaxsd_avx(auVar155,auVar136);
  auVar72 = vpmaxsd_avx(auVar161,auVar133);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vpmaxsd_avx(auVar150,auVar125);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar76._4_4_ = uVar123;
  auVar76._0_4_ = uVar123;
  auVar76._8_4_ = uVar123;
  auVar76._12_4_ = uVar123;
  auVar72 = vminps_avx512vl(auVar72,auVar76);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar23);
  uVar131 = vcmpps_avx512vl(local_290,auVar74,2);
  uVar65 = vpcmpgtd_avx512vl(auVar73,_DAT_01f7fcf0);
  uVar65 = ((byte)uVar131 & 0xf) & uVar65;
  if ((char)uVar65 == '\0') {
    bVar62 = false;
  }
  else {
    local_468 = pre->ray_space + k;
    local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar25 = 0;
      for (uVar67 = uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_5e8 = (ulong)*(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[local_5e8].ptr;
      local_530._0_8_ = CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6));
      uVar67 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6)));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar10[1].time_range.upper;
      local_5e0 = *(undefined1 (*) [16])(lVar25 + (long)p_Var11 * uVar67);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar67 + 1) * (long)p_Var11);
      local_5c0 = *(undefined8 *)*pauVar3;
      uStack_5b8 = *(undefined8 *)(*pauVar3 + 8);
      auVar74 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar67 + 2) * (long)p_Var11);
      local_5d0 = *(undefined8 *)*pauVar4;
      uStack_5c8 = *(undefined8 *)(*pauVar4 + 8);
      auVar72 = *pauVar4;
      uVar65 = uVar65 - 1 & uVar65;
      pauVar5 = (undefined1 (*) [12])(lVar25 + (uVar67 + 3) * (long)p_Var11);
      local_480 = (float)*(undefined8 *)*pauVar5;
      fStack_47c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_478 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_474 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar65 != 0) {
        uVar61 = uVar65 - 1 & uVar65;
        for (uVar67 = uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
        }
        if (uVar61 != 0) {
          for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar75 = vsubps_avx(local_5e0,auVar18);
      uVar123 = auVar75._0_4_;
      auVar137._4_4_ = uVar123;
      auVar137._0_4_ = uVar123;
      auVar137._8_4_ = uVar123;
      auVar137._12_4_ = uVar123;
      auVar19 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      aVar6 = (local_468->vx).field_0;
      aVar7 = (local_468->vy).field_0;
      fVar139 = (local_468->vz).field_0.m128[0];
      fVar128 = *(float *)((long)&(local_468->vz).field_0 + 4);
      fVar129 = *(float *)((long)&(local_468->vz).field_0 + 8);
      fVar130 = *(float *)((long)&(local_468->vz).field_0 + 0xc);
      auVar166._0_4_ = fVar139 * auVar75._0_4_;
      auVar166._4_4_ = fVar128 * auVar75._4_4_;
      auVar166._8_4_ = fVar129 * auVar75._8_4_;
      auVar166._12_4_ = fVar130 * auVar75._12_4_;
      auVar19 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar7,auVar19);
      auVar21 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar137);
      auVar19 = vshufps_avx(local_5e0,local_5e0,0xff);
      auVar20 = vsubps_avx(auVar74,auVar18);
      uVar123 = auVar20._0_4_;
      auVar142._4_4_ = uVar123;
      auVar142._0_4_ = uVar123;
      auVar142._8_4_ = uVar123;
      auVar142._12_4_ = uVar123;
      auVar75 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar167._0_4_ = fVar139 * auVar20._0_4_;
      auVar167._4_4_ = fVar128 * auVar20._4_4_;
      auVar167._8_4_ = fVar129 * auVar20._8_4_;
      auVar167._12_4_ = fVar130 * auVar20._12_4_;
      auVar75 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar7,auVar75);
      auVar22 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar142);
      auVar74 = vshufps_avx(auVar74,auVar74,0xff);
      auVar20 = vsubps_avx(auVar72,auVar18);
      uVar123 = auVar20._0_4_;
      auVar164._4_4_ = uVar123;
      auVar164._0_4_ = uVar123;
      auVar164._8_4_ = uVar123;
      auVar164._12_4_ = uVar123;
      auVar75 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar170._0_4_ = fVar139 * auVar20._0_4_;
      auVar170._4_4_ = fVar128 * auVar20._4_4_;
      auVar170._8_4_ = fVar129 * auVar20._8_4_;
      auVar170._12_4_ = fVar130 * auVar20._12_4_;
      auVar75 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar7,auVar75);
      auVar20 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar164);
      auVar72 = vshufps_avx(auVar72,auVar72,0xff);
      auVar58._12_4_ = fStack_474;
      auVar58._0_12_ = *pauVar5;
      auVar75 = vsubps_avx512vl(auVar58,auVar18);
      uVar123 = auVar75._0_4_;
      auVar143._4_4_ = uVar123;
      auVar143._0_4_ = uVar123;
      auVar143._8_4_ = uVar123;
      auVar143._12_4_ = uVar123;
      auVar18 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar171._0_4_ = fVar139 * auVar75._0_4_;
      auVar171._4_4_ = fVar128 * auVar75._4_4_;
      auVar171._8_4_ = fVar129 * auVar75._8_4_;
      auVar171._12_4_ = fVar130 * auVar75._12_4_;
      auVar18 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar7,auVar18);
      auVar18 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar6,auVar143);
      lVar25 = (long)iVar9 * 0x44;
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      auVar75 = vshufps_avx512vl(auVar58,auVar58,0xff);
      local_400 = vbroadcastss_avx512vl(auVar21);
      auVar78._8_4_ = 1;
      auVar78._0_8_ = 0x100000001;
      auVar78._12_4_ = 1;
      auVar78._16_4_ = 1;
      auVar78._20_4_ = 1;
      auVar78._24_4_ = 1;
      auVar78._28_4_ = 1;
      local_3e0 = vpermps_avx512vl(auVar78,ZEXT1632(auVar21));
      uVar131 = auVar19._0_8_;
      local_80._8_8_ = uVar131;
      local_80._0_8_ = uVar131;
      local_80._16_8_ = uVar131;
      local_80._24_8_ = uVar131;
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      uVar123 = auVar22._0_4_;
      local_560._4_4_ = uVar123;
      local_560._0_4_ = uVar123;
      local_560._8_4_ = uVar123;
      local_560._12_4_ = uVar123;
      local_560._16_4_ = uVar123;
      local_560._20_4_ = uVar123;
      local_560._24_4_ = uVar123;
      local_560._28_4_ = uVar123;
      local_520 = vpermps_avx512vl(auVar78,ZEXT1632(auVar22));
      uVar131 = auVar74._0_8_;
      local_a0._8_8_ = uVar131;
      local_a0._0_8_ = uVar131;
      local_a0._16_8_ = uVar131;
      local_a0._24_8_ = uVar131;
      auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_4c0 = vbroadcastss_avx512vl(auVar20);
      local_420 = vpermps_avx2(auVar78,ZEXT1632(auVar20));
      local_c0 = vbroadcastsd_avx512vl(auVar72);
      auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar18);
      auVar188 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar78,ZEXT1632(auVar18));
      auVar189 = ZEXT3264(local_500);
      _local_e0 = vbroadcastsd_avx512vl(auVar75);
      auVar78 = vmulps_avx512vl(local_4e0,auVar92);
      auVar79 = vmulps_avx512vl(local_500,auVar92);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar93,local_4c0);
      auVar74 = vfmadd231ps_fma(auVar79,auVar93,local_420);
      auVar72 = vfmadd231ps_fma(auVar78,auVar95,local_560);
      auVar80 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar95,local_520);
      auVar81 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar94,local_400);
      auVar78 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar79 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar82 = vfmadd231ps_avx512vl(auVar80,auVar94,local_3e0);
      auVar80 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar83 = vmulps_avx512vl(local_4e0,auVar91);
      auVar84 = vmulps_avx512vl(local_500,auVar91);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar80,local_4c0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar80,local_420);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,local_560);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar79,local_520);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar78,local_400);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar78,local_3e0);
      auVar85 = vsubps_avx512vl(auVar83,auVar81);
      auVar86 = vsubps_avx512vl(auVar84,auVar82);
      auVar87 = vmulps_avx512vl(auVar82,auVar85);
      auVar88 = vmulps_avx512vl(auVar81,auVar86);
      auVar87 = vsubps_avx512vl(auVar87,auVar88);
      auVar88 = vmulps_avx512vl(_local_e0,auVar92);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_c0);
      auVar74 = vfmadd231ps_fma(auVar88,auVar95,local_a0);
      auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,local_80);
      auVar89 = vmulps_avx512vl(_local_e0,auVar91);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar80,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar79,local_a0);
      auVar19 = vfmadd231ps_fma(auVar89,auVar78,local_80);
      auVar89 = vmulps_avx512vl(auVar86,auVar86);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar85);
      auVar90 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar19));
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      auVar89 = vmulps_avx512vl(auVar90,auVar89);
      auVar87 = vmulps_avx512vl(auVar87,auVar87);
      uVar131 = vcmpps_avx512vl(auVar87,auVar89,2);
      auVar74 = vblendps_avx(auVar21,local_5e0,8);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar72 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar22,*pauVar3,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar72 = vmaxps_avx(auVar72,auVar74);
      auVar74 = vblendps_avx(auVar20,*pauVar4,8);
      auVar76 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar18,auVar58,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vmaxps_avx(auVar76,auVar74);
      auVar74 = vmaxps_avx(auVar72,auVar74);
      auVar72 = vmovshdup_avx(auVar74);
      auVar72 = vmaxss_avx(auVar72,auVar74);
      auVar74 = vshufpd_avx(auVar74,auVar74,1);
      auVar74 = vmaxss_avx(auVar74,auVar72);
      local_540._0_4_ = (undefined4)iVar9;
      local_540._4_12_ = auVar21._4_12_;
      auVar89._4_4_ = local_540._0_4_;
      auVar89._0_4_ = local_540._0_4_;
      auVar89._8_4_ = local_540._0_4_;
      auVar89._12_4_ = local_540._0_4_;
      auVar89._16_4_ = local_540._0_4_;
      auVar89._20_4_ = local_540._0_4_;
      auVar89._24_4_ = local_540._0_4_;
      auVar89._28_4_ = local_540._0_4_;
      uVar24 = vcmpps_avx512vl(auVar89,_DAT_01faff40,0xe);
      bVar66 = (byte)uVar131 & (byte)uVar24;
      auVar74 = vmulss_avx512f(auVar74,ZEXT416(0x35000000));
      auVar87._8_4_ = 2;
      auVar87._0_8_ = 0x200000002;
      auVar87._12_4_ = 2;
      auVar87._16_4_ = 2;
      auVar87._20_4_ = 2;
      auVar87._24_4_ = 2;
      auVar87._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar87,ZEXT1632(auVar21));
      local_120 = vpermps_avx512vl(auVar87,ZEXT1632(auVar22));
      local_140 = vpermps_avx512vl(auVar87,ZEXT1632(auVar20));
      local_4a0 = vpermps_avx2(auVar87,ZEXT1632(auVar18));
      uVar64 = *(uint *)(ray + k * 4 + 0x30);
      auVar72 = auVar85._0_16_;
      if (bVar66 == 0) {
        bVar62 = false;
        auVar72 = vxorps_avx512vl(auVar72,auVar72);
        auVar185 = ZEXT1664(auVar72);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar182 = ZEXT3264(auVar94);
        auVar183 = ZEXT3264(local_400);
        auVar184 = ZEXT3264(local_3e0);
        auVar180 = ZEXT3264(local_560);
        auVar181 = ZEXT3264(local_520);
        auVar186 = ZEXT3264(local_4c0);
        auVar187 = ZEXT3264(local_420);
      }
      else {
        local_440._0_16_ = ZEXT416(uVar64);
        local_3c0._0_16_ = auVar74;
        auVar91 = vmulps_avx512vl(local_4a0,auVar91);
        auVar80 = vfmadd213ps_avx512vl(auVar80,local_140,auVar91);
        auVar79 = vfmadd213ps_avx512vl(auVar79,local_120,auVar80);
        auVar91 = vfmadd213ps_avx512vl(auVar78,local_100,auVar79);
        auVar92 = vmulps_avx512vl(local_4a0,auVar92);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
        auVar79 = vfmadd213ps_avx512vl(auVar95,local_120,auVar93);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar78 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar87 = vfmadd213ps_avx512vl(auVar94,local_100,auVar79);
        auVar94 = vmulps_avx512vl(local_4e0,auVar78);
        auVar79 = vmulps_avx512vl(local_500,auVar78);
        auVar78 = vmulps_avx512vl(local_4a0,auVar78);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_4c0);
        auVar18 = vfmadd231ps_fma(auVar79,auVar92,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar78,local_140,auVar92);
        auVar75 = vfmadd231ps_fma(auVar94,auVar93,local_560);
        auVar181 = ZEXT3264(local_520);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar93,local_520);
        auVar78 = vfmadd231ps_avx512vl(auVar92,local_120,auVar93);
        auVar79 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar95,local_400);
        auVar80 = vfmadd231ps_avx512vl(auVar94,auVar95,local_3e0);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar78 = vfmadd231ps_avx512vl(auVar78,local_100,auVar95);
        auVar95 = vmulps_avx512vl(local_4e0,auVar92);
        auVar89 = vmulps_avx512vl(local_500,auVar92);
        auVar92 = vmulps_avx512vl(local_4a0,auVar92);
        auVar190 = ZEXT1664(auVar74);
        auVar90 = vfmadd231ps_avx512vl(auVar95,auVar93,local_4c0);
        auVar18 = vfmadd231ps_fma(auVar89,auVar93,local_420);
        auVar187 = ZEXT3264(local_420);
        auVar93 = vfmadd231ps_avx512vl(auVar92,local_140,auVar93);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar90,auVar95,local_560);
        auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar95,local_520);
        auVar95 = vfmadd231ps_avx512vl(auVar93,local_120,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar92,auVar94,local_400);
        auVar92 = vfmadd231ps_avx512vl(auVar89,auVar94,local_3e0);
        auVar89 = vfmadd231ps_avx512vl(auVar95,local_100,auVar94);
        auVar178._8_4_ = 0x7fffffff;
        auVar178._0_8_ = 0x7fffffff7fffffff;
        auVar178._12_4_ = 0x7fffffff;
        auVar178._16_4_ = 0x7fffffff;
        auVar178._20_4_ = 0x7fffffff;
        auVar178._24_4_ = 0x7fffffff;
        auVar178._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(auVar79,auVar178);
        auVar95 = vandps_avx(auVar80,auVar178);
        auVar95 = vmaxps_avx(auVar94,auVar95);
        auVar94 = vandps_avx(auVar78,auVar178);
        auVar94 = vmaxps_avx(auVar95,auVar94);
        auVar78 = vbroadcastss_avx512vl(auVar74);
        uVar67 = vcmpps_avx512vl(auVar94,auVar78,1);
        bVar62 = (bool)((byte)uVar67 & 1);
        auVar90._0_4_ = (float)((uint)bVar62 * auVar85._0_4_ | (uint)!bVar62 * auVar79._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar90._4_4_ = (float)((uint)bVar62 * auVar85._4_4_ | (uint)!bVar62 * auVar79._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar90._8_4_ = (float)((uint)bVar62 * auVar85._8_4_ | (uint)!bVar62 * auVar79._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar90._12_4_ = (float)((uint)bVar62 * auVar85._12_4_ | (uint)!bVar62 * auVar79._12_4_);
        bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar90._16_4_ = (float)((uint)bVar62 * auVar85._16_4_ | (uint)!bVar62 * auVar79._16_4_);
        bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar90._20_4_ = (float)((uint)bVar62 * auVar85._20_4_ | (uint)!bVar62 * auVar79._20_4_);
        bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar90._24_4_ = (float)((uint)bVar62 * auVar85._24_4_ | (uint)!bVar62 * auVar79._24_4_);
        bVar62 = SUB81(uVar67 >> 7,0);
        auVar90._28_4_ = (uint)bVar62 * auVar85._28_4_ | (uint)!bVar62 * auVar79._28_4_;
        bVar62 = (bool)((byte)uVar67 & 1);
        auVar96._0_4_ = (float)((uint)bVar62 * auVar86._0_4_ | (uint)!bVar62 * auVar80._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar62 * auVar86._4_4_ | (uint)!bVar62 * auVar80._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar62 * auVar86._8_4_ | (uint)!bVar62 * auVar80._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar62 * auVar86._12_4_ | (uint)!bVar62 * auVar80._12_4_);
        bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar62 * auVar86._16_4_ | (uint)!bVar62 * auVar80._16_4_);
        bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar62 * auVar86._20_4_ | (uint)!bVar62 * auVar80._20_4_);
        bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar62 * auVar86._24_4_ | (uint)!bVar62 * auVar80._24_4_);
        bVar62 = SUB81(uVar67 >> 7,0);
        auVar96._28_4_ = (uint)bVar62 * auVar86._28_4_ | (uint)!bVar62 * auVar80._28_4_;
        auVar94 = vandps_avx(auVar178,auVar93);
        auVar95 = vandps_avx(auVar92,auVar178);
        auVar95 = vmaxps_avx(auVar94,auVar95);
        auVar94 = vandps_avx(auVar89,auVar178);
        auVar94 = vmaxps_avx(auVar95,auVar94);
        uVar67 = vcmpps_avx512vl(auVar94,auVar78,1);
        bVar62 = (bool)((byte)uVar67 & 1);
        auVar97._0_4_ = (float)((uint)bVar62 * auVar85._0_4_ | (uint)!bVar62 * auVar93._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar62 * auVar85._4_4_ | (uint)!bVar62 * auVar93._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar62 * auVar85._8_4_ | (uint)!bVar62 * auVar93._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar62 * auVar85._12_4_ | (uint)!bVar62 * auVar93._12_4_);
        bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar97._16_4_ = (float)((uint)bVar62 * auVar85._16_4_ | (uint)!bVar62 * auVar93._16_4_);
        bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar97._20_4_ = (float)((uint)bVar62 * auVar85._20_4_ | (uint)!bVar62 * auVar93._20_4_);
        bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar97._24_4_ = (float)((uint)bVar62 * auVar85._24_4_ | (uint)!bVar62 * auVar93._24_4_);
        bVar62 = SUB81(uVar67 >> 7,0);
        auVar97._28_4_ = (uint)bVar62 * auVar85._28_4_ | (uint)!bVar62 * auVar93._28_4_;
        bVar62 = (bool)((byte)uVar67 & 1);
        auVar85._0_4_ = (float)((uint)bVar62 * auVar86._0_4_ | (uint)!bVar62 * auVar92._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar85._4_4_ = (float)((uint)bVar62 * auVar86._4_4_ | (uint)!bVar62 * auVar92._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar85._8_4_ = (float)((uint)bVar62 * auVar86._8_4_ | (uint)!bVar62 * auVar92._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar85._12_4_ = (float)((uint)bVar62 * auVar86._12_4_ | (uint)!bVar62 * auVar92._12_4_);
        bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar85._16_4_ = (float)((uint)bVar62 * auVar86._16_4_ | (uint)!bVar62 * auVar92._16_4_);
        bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar85._20_4_ = (float)((uint)bVar62 * auVar86._20_4_ | (uint)!bVar62 * auVar92._20_4_);
        bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar85._24_4_ = (float)((uint)bVar62 * auVar86._24_4_ | (uint)!bVar62 * auVar92._24_4_);
        bVar62 = SUB81(uVar67 >> 7,0);
        auVar85._28_4_ = (uint)bVar62 * auVar86._28_4_ | (uint)!bVar62 * auVar92._28_4_;
        auVar77 = vxorps_avx512vl(auVar72,auVar72);
        auVar185 = ZEXT1664(auVar77);
        auVar94 = vfmadd213ps_avx512vl(auVar90,auVar90,ZEXT1632(auVar77));
        auVar72 = vfmadd231ps_fma(auVar94,auVar96,auVar96);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar72));
        fVar139 = auVar93._0_4_;
        fVar128 = auVar93._4_4_;
        fVar129 = auVar93._8_4_;
        fVar130 = auVar93._12_4_;
        fVar158 = auVar93._16_4_;
        fVar162 = auVar93._20_4_;
        fVar68 = auVar93._24_4_;
        auVar94._4_4_ = fVar128 * fVar128 * fVar128 * auVar72._4_4_ * -0.5;
        auVar94._0_4_ = fVar139 * fVar139 * fVar139 * auVar72._0_4_ * -0.5;
        auVar94._8_4_ = fVar129 * fVar129 * fVar129 * auVar72._8_4_ * -0.5;
        auVar94._12_4_ = fVar130 * fVar130 * fVar130 * auVar72._12_4_ * -0.5;
        auVar94._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar94._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar94._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar94._28_4_ = 0;
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar78,auVar93);
        auVar95._4_4_ = auVar96._4_4_ * auVar94._4_4_;
        auVar95._0_4_ = auVar96._0_4_ * auVar94._0_4_;
        auVar95._8_4_ = auVar96._8_4_ * auVar94._8_4_;
        auVar95._12_4_ = auVar96._12_4_ * auVar94._12_4_;
        auVar95._16_4_ = auVar96._16_4_ * auVar94._16_4_;
        auVar95._20_4_ = auVar96._20_4_ * auVar94._20_4_;
        auVar95._24_4_ = auVar96._24_4_ * auVar94._24_4_;
        auVar95._28_4_ = auVar93._28_4_;
        auVar93._4_4_ = auVar94._4_4_ * -auVar90._4_4_;
        auVar93._0_4_ = auVar94._0_4_ * -auVar90._0_4_;
        auVar93._8_4_ = auVar94._8_4_ * -auVar90._8_4_;
        auVar93._12_4_ = auVar94._12_4_ * -auVar90._12_4_;
        auVar93._16_4_ = auVar94._16_4_ * -auVar90._16_4_;
        auVar93._20_4_ = auVar94._20_4_ * -auVar90._20_4_;
        auVar93._24_4_ = auVar94._24_4_ * -auVar90._24_4_;
        auVar93._28_4_ = auVar90._28_4_ ^ 0x80000000;
        auVar86 = vmulps_avx512vl(auVar94,ZEXT1632(auVar77));
        auVar89 = ZEXT1632(auVar77);
        auVar92 = vfmadd213ps_avx512vl(auVar97,auVar97,auVar89);
        auVar72 = vfmadd231ps_fma(auVar92,auVar85,auVar85);
        auVar80 = vrsqrt14ps_avx512vl(ZEXT1632(auVar72));
        fVar139 = auVar80._0_4_;
        fVar128 = auVar80._4_4_;
        fVar129 = auVar80._8_4_;
        fVar130 = auVar80._12_4_;
        fVar158 = auVar80._16_4_;
        fVar162 = auVar80._20_4_;
        fVar68 = auVar80._24_4_;
        auVar92._4_4_ = fVar128 * fVar128 * fVar128 * auVar72._4_4_ * -0.5;
        auVar92._0_4_ = fVar139 * fVar139 * fVar139 * auVar72._0_4_ * -0.5;
        auVar92._8_4_ = fVar129 * fVar129 * fVar129 * auVar72._8_4_ * -0.5;
        auVar92._12_4_ = fVar130 * fVar130 * fVar130 * auVar72._12_4_ * -0.5;
        auVar92._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar92._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar92._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar92._28_4_ = 0;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar78,auVar80);
        auVar79._4_4_ = auVar85._4_4_ * auVar92._4_4_;
        auVar79._0_4_ = auVar85._0_4_ * auVar92._0_4_;
        auVar79._8_4_ = auVar85._8_4_ * auVar92._8_4_;
        auVar79._12_4_ = auVar85._12_4_ * auVar92._12_4_;
        auVar79._16_4_ = auVar85._16_4_ * auVar92._16_4_;
        auVar79._20_4_ = auVar85._20_4_ * auVar92._20_4_;
        auVar79._24_4_ = auVar85._24_4_ * auVar92._24_4_;
        auVar79._28_4_ = auVar80._28_4_;
        auVar80._4_4_ = -auVar97._4_4_ * auVar92._4_4_;
        auVar80._0_4_ = -auVar97._0_4_ * auVar92._0_4_;
        auVar80._8_4_ = -auVar97._8_4_ * auVar92._8_4_;
        auVar80._12_4_ = -auVar97._12_4_ * auVar92._12_4_;
        auVar80._16_4_ = -auVar97._16_4_ * auVar92._16_4_;
        auVar80._20_4_ = -auVar97._20_4_ * auVar92._20_4_;
        auVar80._24_4_ = -auVar97._24_4_ * auVar92._24_4_;
        auVar80._28_4_ = auVar94._28_4_;
        auVar94 = vmulps_avx512vl(auVar92,auVar89);
        auVar72 = vfmadd213ps_fma(auVar95,auVar88,auVar81);
        auVar18 = vfmadd213ps_fma(auVar93,auVar88,auVar82);
        auVar92 = vfmadd213ps_avx512vl(auVar86,auVar88,auVar87);
        auVar78 = vfmadd213ps_avx512vl(auVar79,ZEXT1632(auVar19),auVar83);
        auVar76 = vfnmadd213ps_fma(auVar95,auVar88,auVar81);
        auVar81 = ZEXT1632(auVar19);
        auVar75 = vfmadd213ps_fma(auVar80,auVar81,auVar84);
        auVar23 = vfnmadd213ps_fma(auVar93,auVar88,auVar82);
        auVar20 = vfmadd213ps_fma(auVar94,auVar81,auVar91);
        auVar95 = vfnmadd231ps_avx512vl(auVar87,auVar88,auVar86);
        auVar73 = vfnmadd213ps_fma(auVar79,auVar81,auVar83);
        auVar71 = vfnmadd213ps_fma(auVar80,auVar81,auVar84);
        auVar70 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar19),auVar94);
        auVar93 = vsubps_avx512vl(auVar78,ZEXT1632(auVar76));
        auVar94 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar23));
        auVar79 = vsubps_avx512vl(ZEXT1632(auVar20),auVar95);
        auVar80 = vmulps_avx512vl(auVar94,auVar95);
        auVar21 = vfmsub231ps_fma(auVar80,ZEXT1632(auVar23),auVar79);
        auVar91._4_4_ = auVar76._4_4_ * auVar79._4_4_;
        auVar91._0_4_ = auVar76._0_4_ * auVar79._0_4_;
        auVar91._8_4_ = auVar76._8_4_ * auVar79._8_4_;
        auVar91._12_4_ = auVar76._12_4_ * auVar79._12_4_;
        auVar91._16_4_ = auVar79._16_4_ * 0.0;
        auVar91._20_4_ = auVar79._20_4_ * 0.0;
        auVar91._24_4_ = auVar79._24_4_ * 0.0;
        auVar91._28_4_ = auVar79._28_4_;
        auVar79 = vfmsub231ps_avx512vl(auVar91,auVar95,auVar93);
        auVar81._4_4_ = auVar23._4_4_ * auVar93._4_4_;
        auVar81._0_4_ = auVar23._0_4_ * auVar93._0_4_;
        auVar81._8_4_ = auVar23._8_4_ * auVar93._8_4_;
        auVar81._12_4_ = auVar23._12_4_ * auVar93._12_4_;
        auVar81._16_4_ = auVar93._16_4_ * 0.0;
        auVar81._20_4_ = auVar93._20_4_ * 0.0;
        auVar81._24_4_ = auVar93._24_4_ * 0.0;
        auVar81._28_4_ = auVar93._28_4_;
        auVar22 = vfmsub231ps_fma(auVar81,ZEXT1632(auVar76),auVar94);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar89,auVar79);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar21));
        auVar85 = ZEXT1632(auVar77);
        uVar67 = vcmpps_avx512vl(auVar94,auVar85,2);
        bVar60 = (byte)uVar67;
        fVar68 = (float)((uint)(bVar60 & 1) * auVar72._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar73._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar114 = (float)((uint)bVar62 * auVar72._4_4_ | (uint)!bVar62 * auVar73._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar116 = (float)((uint)bVar62 * auVar72._8_4_ | (uint)!bVar62 * auVar73._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar119 = (float)((uint)bVar62 * auVar72._12_4_ | (uint)!bVar62 * auVar73._12_4_);
        auVar80 = ZEXT1632(CONCAT412(fVar119,CONCAT48(fVar116,CONCAT44(fVar114,fVar68))));
        fVar69 = (float)((uint)(bVar60 & 1) * auVar18._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar71._0_4_);
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        fVar115 = (float)((uint)bVar62 * auVar18._4_4_ | (uint)!bVar62 * auVar71._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        fVar117 = (float)((uint)bVar62 * auVar18._8_4_ | (uint)!bVar62 * auVar71._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        fVar120 = (float)((uint)bVar62 * auVar18._12_4_ | (uint)!bVar62 * auVar71._12_4_);
        auVar91 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar117,CONCAT44(fVar115,fVar69))));
        auVar86._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar70._0_4_)
        ;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar86._4_4_ = (float)((uint)bVar62 * auVar92._4_4_ | (uint)!bVar62 * auVar70._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar86._8_4_ = (float)((uint)bVar62 * auVar92._8_4_ | (uint)!bVar62 * auVar70._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar86._12_4_ = (float)((uint)bVar62 * auVar92._12_4_ | (uint)!bVar62 * auVar70._12_4_);
        fVar139 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar92._16_4_);
        auVar86._16_4_ = fVar139;
        fVar128 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar92._20_4_);
        auVar86._20_4_ = fVar128;
        fVar129 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar92._24_4_);
        auVar86._24_4_ = fVar129;
        iVar1 = (uint)(byte)(uVar67 >> 7) * auVar92._28_4_;
        auVar86._28_4_ = iVar1;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar78);
        auVar98._0_4_ =
             (uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar21._0_4_;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar98._4_4_ = (uint)bVar62 * auVar93._4_4_ | (uint)!bVar62 * auVar21._4_4_;
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar98._8_4_ = (uint)bVar62 * auVar93._8_4_ | (uint)!bVar62 * auVar21._8_4_;
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar98._12_4_ = (uint)bVar62 * auVar93._12_4_ | (uint)!bVar62 * auVar21._12_4_;
        auVar98._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_;
        auVar98._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_;
        auVar98._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_;
        auVar98._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar23),ZEXT1632(auVar75));
        auVar99._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar18._0_4_)
        ;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar62 * auVar93._4_4_ | (uint)!bVar62 * auVar18._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar62 * auVar93._8_4_ | (uint)!bVar62 * auVar18._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar62 * auVar93._12_4_ | (uint)!bVar62 * auVar18._12_4_);
        fVar130 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_);
        auVar99._16_4_ = fVar130;
        fVar162 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_);
        auVar99._20_4_ = fVar162;
        fVar158 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_);
        auVar99._24_4_ = fVar158;
        auVar99._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar20));
        auVar100._0_4_ =
             (float)((uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar92._0_4_)
        ;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar62 * auVar93._4_4_ | (uint)!bVar62 * auVar92._4_4_);
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar62 * auVar93._8_4_ | (uint)!bVar62 * auVar92._8_4_);
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar62 * auVar93._12_4_ | (uint)!bVar62 * auVar92._12_4_);
        bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar62 * auVar93._16_4_ | (uint)!bVar62 * auVar92._16_4_);
        bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar62 * auVar93._20_4_ | (uint)!bVar62 * auVar92._20_4_);
        bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar62 * auVar93._24_4_ | (uint)!bVar62 * auVar92._24_4_);
        bVar62 = SUB81(uVar67 >> 7,0);
        auVar100._28_4_ = (uint)bVar62 * auVar93._28_4_ | (uint)!bVar62 * auVar92._28_4_;
        auVar101._0_4_ =
             (uint)(bVar60 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar78._0_4_;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar62 * (int)auVar76._4_4_ | (uint)!bVar62 * auVar78._4_4_;
        bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar62 * (int)auVar76._8_4_ | (uint)!bVar62 * auVar78._8_4_;
        bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar62 * (int)auVar76._12_4_ | (uint)!bVar62 * auVar78._12_4_;
        auVar101._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar78._16_4_;
        auVar101._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar78._20_4_;
        auVar101._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar78._24_4_;
        auVar101._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar78._28_4_;
        bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar102._0_4_ =
             (uint)(bVar60 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar20._0_4_;
        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar20._4_4_;
        bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar20._8_4_;
        bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar20._12_4_;
        auVar102._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar95._16_4_;
        auVar102._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar95._20_4_;
        auVar102._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar67 >> 7) * auVar95._28_4_;
        auVar102._28_4_ = iVar2;
        auVar81 = vsubps_avx512vl(auVar101,auVar80);
        auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar23._12_4_ |
                                                (uint)!bVar15 * auVar75._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar23._8_4_ |
                                                         (uint)!bVar13 * auVar75._8_4_,
                                                         CONCAT44((uint)bVar62 * (int)auVar23._4_4_
                                                                  | (uint)!bVar62 * auVar75._4_4_,
                                                                  (uint)(bVar60 & 1) *
                                                                  (int)auVar23._0_4_ |
                                                                  (uint)!(bool)(bVar60 & 1) *
                                                                  auVar75._0_4_)))),auVar91);
        auVar93 = vsubps_avx(auVar102,auVar86);
        auVar92 = vsubps_avx(auVar80,auVar98);
        auVar78 = vsubps_avx(auVar91,auVar99);
        auVar79 = vsubps_avx(auVar86,auVar100);
        auVar82._4_4_ = auVar93._4_4_ * fVar114;
        auVar82._0_4_ = auVar93._0_4_ * fVar68;
        auVar82._8_4_ = auVar93._8_4_ * fVar116;
        auVar82._12_4_ = auVar93._12_4_ * fVar119;
        auVar82._16_4_ = auVar93._16_4_ * 0.0;
        auVar82._20_4_ = auVar93._20_4_ * 0.0;
        auVar82._24_4_ = auVar93._24_4_ * 0.0;
        auVar82._28_4_ = iVar2;
        auVar72 = vfmsub231ps_fma(auVar82,auVar86,auVar81);
        auVar83._4_4_ = fVar115 * auVar81._4_4_;
        auVar83._0_4_ = fVar69 * auVar81._0_4_;
        auVar83._8_4_ = fVar117 * auVar81._8_4_;
        auVar83._12_4_ = fVar120 * auVar81._12_4_;
        auVar83._16_4_ = auVar81._16_4_ * 0.0;
        auVar83._20_4_ = auVar81._20_4_ * 0.0;
        auVar83._24_4_ = auVar81._24_4_ * 0.0;
        auVar83._28_4_ = auVar94._28_4_;
        auVar18 = vfmsub231ps_fma(auVar83,auVar80,auVar95);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar85,ZEXT1632(auVar72));
        auVar151._0_4_ = auVar95._0_4_ * auVar86._0_4_;
        auVar151._4_4_ = auVar95._4_4_ * auVar86._4_4_;
        auVar151._8_4_ = auVar95._8_4_ * auVar86._8_4_;
        auVar151._12_4_ = auVar95._12_4_ * auVar86._12_4_;
        auVar151._16_4_ = auVar95._16_4_ * fVar139;
        auVar151._20_4_ = auVar95._20_4_ * fVar128;
        auVar151._24_4_ = auVar95._24_4_ * fVar129;
        auVar151._28_4_ = 0;
        auVar72 = vfmsub231ps_fma(auVar151,auVar91,auVar93);
        auVar82 = vfmadd231ps_avx512vl(auVar94,auVar85,ZEXT1632(auVar72));
        auVar94 = vmulps_avx512vl(auVar79,auVar98);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar100);
        auVar84._4_4_ = auVar78._4_4_ * auVar100._4_4_;
        auVar84._0_4_ = auVar78._0_4_ * auVar100._0_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar100._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar100._12_4_;
        auVar84._16_4_ = auVar78._16_4_ * auVar100._16_4_;
        auVar84._20_4_ = auVar78._20_4_ * auVar100._20_4_;
        auVar84._24_4_ = auVar78._24_4_ * auVar100._24_4_;
        auVar84._28_4_ = auVar100._28_4_;
        auVar72 = vfmsub231ps_fma(auVar84,auVar99,auVar79);
        auVar152._0_4_ = auVar99._0_4_ * auVar92._0_4_;
        auVar152._4_4_ = auVar99._4_4_ * auVar92._4_4_;
        auVar152._8_4_ = auVar99._8_4_ * auVar92._8_4_;
        auVar152._12_4_ = auVar99._12_4_ * auVar92._12_4_;
        auVar152._16_4_ = fVar130 * auVar92._16_4_;
        auVar152._20_4_ = fVar162 * auVar92._20_4_;
        auVar152._24_4_ = fVar158 * auVar92._24_4_;
        auVar152._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar152,auVar78,auVar98);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar85,auVar94);
        auVar83 = vfmadd231ps_avx512vl(auVar94,auVar85,ZEXT1632(auVar72));
        auVar94 = vmaxps_avx(auVar82,auVar83);
        uVar131 = vcmpps_avx512vl(auVar94,auVar85,2);
        bVar66 = bVar66 & (byte)uVar131;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar182 = ZEXT3264(auVar84);
        auVar183 = ZEXT3264(local_400);
        auVar184 = ZEXT3264(local_3e0);
        auVar180 = ZEXT3264(local_560);
        if (bVar66 == 0) {
          bVar62 = false;
          auVar186 = ZEXT3264(local_4c0);
          auVar188 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
        }
        else {
          uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar174._4_4_ = uVar123;
          auVar174._0_4_ = uVar123;
          auVar174._8_4_ = uVar123;
          auVar174._12_4_ = uVar123;
          auVar174._16_4_ = uVar123;
          auVar174._20_4_ = uVar123;
          auVar174._24_4_ = uVar123;
          auVar174._28_4_ = uVar123;
          auVar176 = ZEXT3264(auVar174);
          auVar31._4_4_ = auVar79._4_4_ * auVar95._4_4_;
          auVar31._0_4_ = auVar79._0_4_ * auVar95._0_4_;
          auVar31._8_4_ = auVar79._8_4_ * auVar95._8_4_;
          auVar31._12_4_ = auVar79._12_4_ * auVar95._12_4_;
          auVar31._16_4_ = auVar79._16_4_ * auVar95._16_4_;
          auVar31._20_4_ = auVar79._20_4_ * auVar95._20_4_;
          auVar31._24_4_ = auVar79._24_4_ * auVar95._24_4_;
          auVar31._28_4_ = auVar94._28_4_;
          auVar75 = vfmsub231ps_fma(auVar31,auVar78,auVar93);
          auVar32._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar32._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar32._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar32._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar32._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar32._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar32._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar32._28_4_ = auVar93._28_4_;
          auVar18 = vfmsub231ps_fma(auVar32,auVar81,auVar79);
          auVar33._4_4_ = auVar78._4_4_ * auVar81._4_4_;
          auVar33._0_4_ = auVar78._0_4_ * auVar81._0_4_;
          auVar33._8_4_ = auVar78._8_4_ * auVar81._8_4_;
          auVar33._12_4_ = auVar78._12_4_ * auVar81._12_4_;
          auVar33._16_4_ = auVar78._16_4_ * auVar81._16_4_;
          auVar33._20_4_ = auVar78._20_4_ * auVar81._20_4_;
          auVar33._24_4_ = auVar78._24_4_ * auVar81._24_4_;
          auVar33._28_4_ = auVar78._28_4_;
          auVar20 = vfmsub231ps_fma(auVar33,auVar92,auVar95);
          auVar72 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar20));
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar75),auVar85);
          auVar95 = vrcp14ps_avx512vl(auVar94);
          auVar93 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar84);
          auVar72 = vfmadd132ps_fma(auVar93,auVar95,auVar95);
          auVar34._4_4_ = auVar20._4_4_ * auVar86._4_4_;
          auVar34._0_4_ = auVar20._0_4_ * auVar86._0_4_;
          auVar34._8_4_ = auVar20._8_4_ * auVar86._8_4_;
          auVar34._12_4_ = auVar20._12_4_ * auVar86._12_4_;
          auVar34._16_4_ = fVar139 * 0.0;
          auVar34._20_4_ = fVar128 * 0.0;
          auVar34._24_4_ = fVar129 * 0.0;
          auVar34._28_4_ = iVar1;
          auVar18 = vfmadd231ps_fma(auVar34,auVar91,ZEXT1632(auVar18));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar80,ZEXT1632(auVar75));
          fVar139 = auVar72._0_4_;
          fVar128 = auVar72._4_4_;
          fVar129 = auVar72._8_4_;
          fVar130 = auVar72._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar18._12_4_ * fVar130,
                                         CONCAT48(auVar18._8_4_ * fVar129,
                                                  CONCAT44(auVar18._4_4_ * fVar128,
                                                           auVar18._0_4_ * fVar139))));
          auVar165._4_4_ = uVar64;
          auVar165._0_4_ = uVar64;
          auVar165._8_4_ = uVar64;
          auVar165._12_4_ = uVar64;
          auVar165._16_4_ = uVar64;
          auVar165._20_4_ = uVar64;
          auVar165._24_4_ = uVar64;
          auVar165._28_4_ = uVar64;
          uVar131 = vcmpps_avx512vl(local_240,auVar174,2);
          uVar24 = vcmpps_avx512vl(auVar165,local_240,2);
          bVar66 = (byte)uVar131 & (byte)uVar24 & bVar66;
          auVar186 = ZEXT3264(local_4c0);
          auVar188 = ZEXT3264(local_4e0);
          auVar189 = ZEXT3264(local_500);
          if (bVar66 != 0) {
            uVar131 = vcmpps_avx512vl(auVar94,auVar85,4);
            bVar66 = bVar66 & (byte)uVar131;
            auVar169 = ZEXT1664(local_5e0);
            if (bVar66 != 0) {
              fVar158 = auVar82._0_4_ * fVar139;
              fVar162 = auVar82._4_4_ * fVar128;
              auVar35._4_4_ = fVar162;
              auVar35._0_4_ = fVar158;
              fVar68 = auVar82._8_4_ * fVar129;
              auVar35._8_4_ = fVar68;
              fVar69 = auVar82._12_4_ * fVar130;
              auVar35._12_4_ = fVar69;
              fVar114 = auVar82._16_4_ * 0.0;
              auVar35._16_4_ = fVar114;
              fVar115 = auVar82._20_4_ * 0.0;
              auVar35._20_4_ = fVar115;
              fVar116 = auVar82._24_4_ * 0.0;
              auVar35._24_4_ = fVar116;
              auVar35._28_4_ = auVar94._28_4_;
              auVar95 = vsubps_avx512vl(auVar84,auVar35);
              local_280._0_4_ =
                   (float)((uint)(bVar60 & 1) * (int)fVar158 |
                          (uint)!(bool)(bVar60 & 1) * auVar95._0_4_);
              bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
              local_280._4_4_ = (float)((uint)bVar62 * (int)fVar162 | (uint)!bVar62 * auVar95._4_4_)
              ;
              bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
              local_280._8_4_ = (float)((uint)bVar62 * (int)fVar68 | (uint)!bVar62 * auVar95._8_4_);
              bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
              local_280._12_4_ =
                   (float)((uint)bVar62 * (int)fVar69 | (uint)!bVar62 * auVar95._12_4_);
              bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
              local_280._16_4_ =
                   (float)((uint)bVar62 * (int)fVar114 | (uint)!bVar62 * auVar95._16_4_);
              bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
              local_280._20_4_ =
                   (float)((uint)bVar62 * (int)fVar115 | (uint)!bVar62 * auVar95._20_4_);
              bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
              local_280._24_4_ =
                   (float)((uint)bVar62 * (int)fVar116 | (uint)!bVar62 * auVar95._24_4_);
              bVar62 = SUB81(uVar67 >> 7,0);
              local_280._28_4_ =
                   (float)((uint)bVar62 * auVar94._28_4_ | (uint)!bVar62 * auVar95._28_4_);
              auVar94 = vsubps_avx(ZEXT1632(auVar19),auVar88);
              auVar72 = vfmadd213ps_fma(auVar94,local_280,auVar88);
              uVar123 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar88._4_4_ = uVar123;
              auVar88._0_4_ = uVar123;
              auVar88._8_4_ = uVar123;
              auVar88._12_4_ = uVar123;
              auVar88._16_4_ = uVar123;
              auVar88._20_4_ = uVar123;
              auVar88._24_4_ = uVar123;
              auVar88._28_4_ = uVar123;
              auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar72._12_4_ + auVar72._12_4_,
                                                           CONCAT48(auVar72._8_4_ + auVar72._8_4_,
                                                                    CONCAT44(auVar72._4_4_ +
                                                                             auVar72._4_4_,
                                                                             auVar72._0_4_ +
                                                                             auVar72._0_4_)))),
                                        auVar88);
              uVar131 = vcmpps_avx512vl(local_240,auVar94,6);
              if (((byte)uVar131 & bVar66) != 0) {
                auVar138._0_4_ = auVar83._0_4_ * fVar139;
                auVar138._4_4_ = auVar83._4_4_ * fVar128;
                auVar138._8_4_ = auVar83._8_4_ * fVar129;
                auVar138._12_4_ = auVar83._12_4_ * fVar130;
                auVar138._16_4_ = auVar83._16_4_ * 0.0;
                auVar138._20_4_ = auVar83._20_4_ * 0.0;
                auVar138._24_4_ = auVar83._24_4_ * 0.0;
                auVar138._28_4_ = 0;
                auVar94 = vsubps_avx512vl(auVar84,auVar138);
                auVar103._0_4_ =
                     (uint)(bVar60 & 1) * (int)auVar138._0_4_ |
                     (uint)!(bool)(bVar60 & 1) * auVar94._0_4_;
                bVar62 = (bool)((byte)(uVar67 >> 1) & 1);
                auVar103._4_4_ = (uint)bVar62 * (int)auVar138._4_4_ | (uint)!bVar62 * auVar94._4_4_;
                bVar62 = (bool)((byte)(uVar67 >> 2) & 1);
                auVar103._8_4_ = (uint)bVar62 * (int)auVar138._8_4_ | (uint)!bVar62 * auVar94._8_4_;
                bVar62 = (bool)((byte)(uVar67 >> 3) & 1);
                auVar103._12_4_ =
                     (uint)bVar62 * (int)auVar138._12_4_ | (uint)!bVar62 * auVar94._12_4_;
                bVar62 = (bool)((byte)(uVar67 >> 4) & 1);
                auVar103._16_4_ =
                     (uint)bVar62 * (int)auVar138._16_4_ | (uint)!bVar62 * auVar94._16_4_;
                bVar62 = (bool)((byte)(uVar67 >> 5) & 1);
                auVar103._20_4_ =
                     (uint)bVar62 * (int)auVar138._20_4_ | (uint)!bVar62 * auVar94._20_4_;
                bVar62 = (bool)((byte)(uVar67 >> 6) & 1);
                auVar103._24_4_ =
                     (uint)bVar62 * (int)auVar138._24_4_ | (uint)!bVar62 * auVar94._24_4_;
                auVar103._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar94._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_260 = vfmsub132ps_avx512vl(auVar103,auVar84,auVar28);
                local_220 = 0;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar62 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar139 = 1.0 / (float)local_540._0_4_;
                    local_1c0[0] = fVar139 * (local_280._0_4_ + 0.0);
                    local_1c0[1] = fVar139 * (local_280._4_4_ + 1.0);
                    local_1c0[2] = fVar139 * (local_280._8_4_ + 2.0);
                    local_1c0[3] = fVar139 * (local_280._12_4_ + 3.0);
                    fStack_1b0 = fVar139 * (local_280._16_4_ + 4.0);
                    fStack_1ac = fVar139 * (local_280._20_4_ + 5.0);
                    fStack_1a8 = fVar139 * (local_280._24_4_ + 6.0);
                    fStack_1a4 = local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    local_2c0 = 0;
                    uVar61 = (ulong)((byte)uVar131 & bVar66);
                    for (uVar67 = uVar61; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      local_2c0 = local_2c0 + 1;
                    }
                    local_5a0 = vpbroadcastd_avx512vl();
                    local_5b0 = vpbroadcastd_avx512vl();
                    local_460 = auVar174;
                    local_21c = iVar9;
                    local_210 = local_5e0;
                    local_200 = local_5c0;
                    uStack_1f8 = uStack_5b8;
                    local_1f0 = local_5d0;
                    uStack_1e8 = uStack_5c8;
                    do {
                      auVar75 = auVar185._0_16_;
                      local_380 = (uint)uVar61;
                      uStack_37c = (uint)(uVar61 >> 0x20);
                      fVar139 = local_1c0[local_2c0];
                      local_320._4_4_ = fVar139;
                      local_320._0_4_ = fVar139;
                      local_320._8_4_ = fVar139;
                      local_320._12_4_ = fVar139;
                      local_310 = *(undefined4 *)(local_1a0 + local_2c0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_180 + local_2c0 * 4);
                      local_590.context = context->user;
                      fVar128 = 1.0 - fVar139;
                      auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar139 * (fVar128 + fVar128))),
                                                 ZEXT416((uint)fVar128),ZEXT416((uint)fVar128));
                      auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_320,
                                                ZEXT416(0xc0a00000));
                      auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * 3.0)),
                                                ZEXT416((uint)(fVar139 + fVar139)),auVar74);
                      auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_320,
                                                ZEXT416(0x40000000));
                      auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128 * -3.0)),
                                                ZEXT416((uint)(fVar128 + fVar128)),auVar74);
                      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),local_320,
                                                ZEXT416((uint)(fVar128 * -2.0)));
                      fVar139 = auVar19._0_4_ * 0.5;
                      fVar128 = auVar72._0_4_ * 0.5;
                      fVar129 = auVar74._0_4_ * 0.5;
                      fVar130 = auVar18._0_4_ * 0.5;
                      auVar144._0_4_ = fVar130 * local_480;
                      auVar144._4_4_ = fVar130 * fStack_47c;
                      auVar144._8_4_ = fVar130 * fStack_478;
                      auVar144._12_4_ = fVar130 * fStack_474;
                      auVar156._4_4_ = fVar129;
                      auVar156._0_4_ = fVar129;
                      auVar156._8_4_ = fVar129;
                      auVar156._12_4_ = fVar129;
                      auVar54._8_8_ = uStack_5c8;
                      auVar54._0_8_ = local_5d0;
                      auVar74 = vfmadd132ps_fma(auVar156,auVar144,auVar54);
                      auVar145._4_4_ = fVar128;
                      auVar145._0_4_ = fVar128;
                      auVar145._8_4_ = fVar128;
                      auVar145._12_4_ = fVar128;
                      auVar56._8_8_ = uStack_5b8;
                      auVar56._0_8_ = local_5c0;
                      auVar74 = vfmadd132ps_fma(auVar145,auVar74,auVar56);
                      auVar126._4_4_ = fVar139;
                      auVar126._0_4_ = fVar139;
                      auVar126._8_4_ = fVar139;
                      auVar126._12_4_ = fVar139;
                      auVar74 = vfmadd213ps_fma(auVar126,auVar169._0_16_,auVar74);
                      local_350 = auVar74._0_4_;
                      local_340 = vshufps_avx(auVar74,auVar74,0x55);
                      local_330 = vshufps_avx(auVar74,auVar74,0xaa);
                      local_300 = local_5b0._0_8_;
                      uStack_2f8 = local_5b0._8_8_;
                      local_2f0 = local_5a0;
                      vpcmpeqd_avx2(ZEXT1632(local_5a0),ZEXT1632(local_5a0));
                      uStack_2dc = (local_590.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_590.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_600 = local_390;
                      local_590.valid = (int *)local_600;
                      local_590.geometryUserPtr = pGVar10->userPtr;
                      local_590.hit = (RTCHitN *)&local_350;
                      local_590.N = 4;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_590);
                        auVar176 = ZEXT3264(local_460);
                        auVar190 = ZEXT1664(local_3c0._0_16_);
                        auVar189 = ZEXT3264(local_500);
                        auVar188 = ZEXT3264(local_4e0);
                        auVar187 = ZEXT3264(local_420);
                        auVar186 = ZEXT3264(local_4c0);
                        auVar181 = ZEXT3264(local_520);
                        auVar180 = ZEXT3264(local_560);
                        auVar184 = ZEXT3264(local_3e0);
                        auVar183 = ZEXT3264(local_400);
                        auVar169 = ZEXT1664(local_5e0);
                        auVar74 = vxorps_avx512vl(auVar75,auVar75);
                        auVar185 = ZEXT1664(auVar74);
                        uVar64 = local_440._0_4_;
                      }
                      auVar74 = auVar185._0_16_;
                      uVar67 = vptestmd_avx512vl(local_600,local_600);
                      if ((uVar67 & 0xf) == 0) {
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar182 = ZEXT3264(auVar94);
                        uVar61 = CONCAT44(uStack_37c,local_380);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar182 = ZEXT3264(auVar94);
                        }
                        else {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar182 = ZEXT3264(auVar94);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_590);
                            auVar176 = ZEXT3264(local_460);
                            auVar190 = ZEXT1664(local_3c0._0_16_);
                            auVar189 = ZEXT3264(local_500);
                            auVar188 = ZEXT3264(local_4e0);
                            auVar187 = ZEXT3264(local_420);
                            auVar186 = ZEXT3264(local_4c0);
                            auVar181 = ZEXT3264(local_520);
                            auVar180 = ZEXT3264(local_560);
                            auVar184 = ZEXT3264(local_3e0);
                            auVar183 = ZEXT3264(local_400);
                            auVar169 = ZEXT1664(local_5e0);
                            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar182 = ZEXT3264(auVar94);
                            auVar74 = vxorps_avx512vl(auVar74,auVar74);
                            auVar185 = ZEXT1664(auVar74);
                            uVar64 = local_440._0_4_;
                          }
                        }
                        auVar74 = auVar190._0_16_;
                        uVar67 = vptestmd_avx512vl(local_600,local_600);
                        uVar67 = uVar67 & 0xf;
                        auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar62 = (bool)((byte)uVar67 & 1);
                        bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar15 = SUB81(uVar67 >> 3,0);
                        *(uint *)(local_590.ray + 0x80) =
                             (uint)bVar62 * auVar72._0_4_ |
                             (uint)!bVar62 * *(int *)(local_590.ray + 0x80);
                        *(uint *)(local_590.ray + 0x84) =
                             (uint)bVar12 * auVar72._4_4_ |
                             (uint)!bVar12 * *(int *)(local_590.ray + 0x84);
                        *(uint *)(local_590.ray + 0x88) =
                             (uint)bVar13 * auVar72._8_4_ |
                             (uint)!bVar13 * *(int *)(local_590.ray + 0x88);
                        *(uint *)(local_590.ray + 0x8c) =
                             (uint)bVar15 * auVar72._12_4_ |
                             (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                        uVar61 = CONCAT44(uStack_37c,local_380);
                        if ((byte)uVar67 != 0) {
                          bVar62 = true;
                          break;
                        }
                      }
                      auVar74 = auVar190._0_16_;
                      *(int *)(ray + k * 4 + 0x80) = auVar176._0_4_;
                      uVar67 = local_2c0 & 0x3f;
                      bVar62 = false;
                      local_2c0 = 0;
                      uVar61 = uVar61 ^ 1L << uVar67;
                      for (uVar67 = uVar61; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        local_2c0 = local_2c0 + 1;
                      }
                    } while (uVar61 != 0);
                  }
                  goto LAB_01ad386e;
                }
              }
            }
          }
          bVar62 = false;
        }
      }
LAB_01ad386e:
      if (8 < iVar9) {
        local_3c0 = vpbroadcastd_avx512vl();
        local_440 = vbroadcastss_avx512vl(auVar74);
        fStack_2b8 = 1.0 / (float)local_540._0_4_;
        local_540 = vpbroadcastd_avx512vl();
        local_530 = vpbroadcastd_avx512vl();
        lVar63 = 8;
        local_520 = auVar181._0_32_;
        local_380 = uVar64;
        uStack_37c = uVar64;
        uStack_378 = uVar64;
        uStack_374 = uVar64;
        uStack_370 = uVar64;
        uStack_36c = uVar64;
        uStack_368 = uVar64;
        uStack_364 = uVar64;
        fStack_2b4 = fStack_2b8;
        fStack_2b0 = fStack_2b8;
        fStack_2ac = fStack_2b8;
        fStack_2a8 = fStack_2b8;
        fStack_2a4 = fStack_2b8;
        local_2c0._0_4_ = fStack_2b8;
        local_2c0._4_4_ = fStack_2b8;
        do {
          auVar94 = vpbroadcastd_avx512vl();
          auVar78 = vpor_avx2(auVar94,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar78,local_3c0,1);
          auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar63 * 4 + lVar25);
          auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar63 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar63 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21b40f8 + lVar63 * 4);
          local_4e0 = auVar188._0_32_;
          auVar79 = vmulps_avx512vl(local_4e0,auVar92);
          local_500 = auVar189._0_32_;
          auVar80 = vmulps_avx512vl(local_500,auVar92);
          auVar36._4_4_ = auVar92._4_4_ * (float)local_e0._4_4_;
          auVar36._0_4_ = auVar92._0_4_ * (float)local_e0._0_4_;
          auVar36._8_4_ = auVar92._8_4_ * fStack_d8;
          auVar36._12_4_ = auVar92._12_4_ * fStack_d4;
          auVar36._16_4_ = auVar92._16_4_ * fStack_d0;
          auVar36._20_4_ = auVar92._20_4_ * fStack_cc;
          auVar36._24_4_ = auVar92._24_4_ * fStack_c8;
          auVar36._28_4_ = auVar78._28_4_;
          local_4c0 = auVar186._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar79,auVar93,local_4c0);
          auVar98 = auVar187._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar80,auVar93,auVar98);
          auVar80 = vfmadd231ps_avx512vl(auVar36,auVar93,local_c0);
          auVar90 = auVar180._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar95,auVar90);
          auVar96 = auVar181._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar95,auVar96);
          auVar74 = vfmadd231ps_fma(auVar80,auVar95,local_a0);
          auVar97 = auVar183._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar78,auVar94,auVar97);
          local_3e0 = auVar184._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar79,auVar94,local_3e0);
          auVar78 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar63 * 4 + lVar25);
          auVar79 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar63 * 4);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar94,local_80);
          auVar80 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar63 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b6518 + lVar63 * 4);
          auVar81 = vmulps_avx512vl(local_4e0,auVar91);
          auVar82 = vmulps_avx512vl(local_500,auVar91);
          auVar37._4_4_ = auVar91._4_4_ * (float)local_e0._4_4_;
          auVar37._0_4_ = auVar91._0_4_ * (float)local_e0._0_4_;
          auVar37._8_4_ = auVar91._8_4_ * fStack_d8;
          auVar37._12_4_ = auVar91._12_4_ * fStack_d4;
          auVar37._16_4_ = auVar91._16_4_ * fStack_d0;
          auVar37._20_4_ = auVar91._20_4_ * fStack_cc;
          auVar37._24_4_ = auVar91._24_4_ * fStack_c8;
          auVar37._28_4_ = uStack_c4;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar80,local_4c0);
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar98);
          auVar85 = vfmadd231ps_avx512vl(auVar37,auVar80,local_c0);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar90);
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar96);
          auVar72 = vfmadd231ps_fma(auVar85,auVar79,local_a0);
          auVar85 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar97);
          auVar86 = vfmadd231ps_avx512vl(auVar82,auVar78,local_3e0);
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar78,local_80);
          auVar87 = vmaxps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar72));
          auVar81 = vsubps_avx(auVar85,auVar83);
          auVar82 = vsubps_avx(auVar86,auVar84);
          auVar88 = vmulps_avx512vl(auVar84,auVar81);
          auVar89 = vmulps_avx512vl(auVar83,auVar82);
          auVar88 = vsubps_avx512vl(auVar88,auVar89);
          auVar89 = vmulps_avx512vl(auVar82,auVar82);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar81,auVar81);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar89);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          uVar131 = vcmpps_avx512vl(auVar88,auVar87,2);
          bVar66 = (byte)uVar24 & (byte)uVar131;
          if (bVar66 == 0) {
            auVar180 = ZEXT3264(auVar90);
          }
          else {
            auVar91 = vmulps_avx512vl(local_4a0,auVar91);
            auVar80 = vfmadd213ps_avx512vl(auVar80,local_140,auVar91);
            auVar79 = vfmadd213ps_avx512vl(auVar79,local_120,auVar80);
            auVar78 = vfmadd213ps_avx512vl(auVar78,local_100,auVar79);
            auVar92 = vmulps_avx512vl(local_4a0,auVar92);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar93);
            auVar79 = vfmadd213ps_avx512vl(auVar94,local_100,auVar95);
            auVar94 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar63 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar63 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar63 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21b5308 + lVar63 * 4);
            auVar80 = vmulps_avx512vl(local_4e0,auVar92);
            auVar91 = vmulps_avx512vl(local_500,auVar92);
            auVar92 = vmulps_avx512vl(local_4a0,auVar92);
            auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,local_4c0);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar98);
            auVar93 = vfmadd231ps_avx512vl(auVar92,local_140,auVar93);
            auVar92 = vfmadd231ps_avx512vl(auVar80,auVar95,auVar90);
            auVar80 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar96);
            auVar95 = vfmadd231ps_avx512vl(auVar93,local_120,auVar95);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar97);
            auVar80 = vfmadd231ps_avx512vl(auVar80,auVar94,local_3e0);
            auVar91 = vfmadd231ps_avx512vl(auVar95,local_100,auVar94);
            auVar94 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar63 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar63 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21b7728 + lVar63 * 4);
            auVar87 = vmulps_avx512vl(local_4e0,auVar93);
            auVar88 = vmulps_avx512vl(local_500,auVar93);
            auVar93 = vmulps_avx512vl(local_4a0,auVar93);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,local_4c0);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar98);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar63 * 4);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar90);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar96);
            auVar95 = vfmadd231ps_avx512vl(auVar93,local_120,auVar95);
            auVar93 = vfmadd231ps_avx512vl(auVar87,auVar94,auVar97);
            auVar87 = vfmadd231ps_avx512vl(auVar88,auVar94,local_3e0);
            auVar95 = vfmadd231ps_avx512vl(auVar95,local_100,auVar94);
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar88);
            vandps_avx512vl(auVar80,auVar88);
            auVar94 = vmaxps_avx(auVar88,auVar88);
            vandps_avx512vl(auVar91,auVar88);
            auVar94 = vmaxps_avx(auVar94,auVar88);
            uVar67 = vcmpps_avx512vl(auVar94,local_440,1);
            bVar12 = (bool)((byte)uVar67 & 1);
            auVar104._0_4_ = (float)((uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar92._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar104._4_4_ = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar92._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar104._8_4_ = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar92._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar104._12_4_ =
                 (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar92._12_4_);
            bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar104._16_4_ =
                 (float)((uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar92._16_4_);
            bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar104._20_4_ =
                 (float)((uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar92._20_4_);
            bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar104._24_4_ =
                 (float)((uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar92._24_4_);
            bVar12 = SUB81(uVar67 >> 7,0);
            auVar104._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar92._28_4_;
            bVar12 = (bool)((byte)uVar67 & 1);
            auVar105._0_4_ = (float)((uint)bVar12 * auVar82._0_4_ | (uint)!bVar12 * auVar80._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar105._4_4_ = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar80._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar105._8_4_ = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar80._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar105._12_4_ =
                 (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar80._12_4_);
            bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar105._16_4_ =
                 (float)((uint)bVar12 * auVar82._16_4_ | (uint)!bVar12 * auVar80._16_4_);
            bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar105._20_4_ =
                 (float)((uint)bVar12 * auVar82._20_4_ | (uint)!bVar12 * auVar80._20_4_);
            bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar105._24_4_ =
                 (float)((uint)bVar12 * auVar82._24_4_ | (uint)!bVar12 * auVar80._24_4_);
            bVar12 = SUB81(uVar67 >> 7,0);
            auVar105._28_4_ = (uint)bVar12 * auVar82._28_4_ | (uint)!bVar12 * auVar80._28_4_;
            vandps_avx512vl(auVar93,auVar88);
            vandps_avx512vl(auVar87,auVar88);
            auVar94 = vmaxps_avx(auVar105,auVar105);
            vandps_avx512vl(auVar95,auVar88);
            auVar94 = vmaxps_avx(auVar94,auVar105);
            uVar67 = vcmpps_avx512vl(auVar94,local_440,1);
            bVar12 = (bool)((byte)uVar67 & 1);
            auVar106._0_4_ = (uint)bVar12 * auVar81._0_4_ | (uint)!bVar12 * auVar93._0_4_;
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar106._4_4_ = (uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar93._4_4_;
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar106._8_4_ = (uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar93._8_4_;
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar106._12_4_ = (uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar93._12_4_;
            bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar106._16_4_ = (uint)bVar12 * auVar81._16_4_ | (uint)!bVar12 * auVar93._16_4_;
            bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar106._20_4_ = (uint)bVar12 * auVar81._20_4_ | (uint)!bVar12 * auVar93._20_4_;
            bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar106._24_4_ = (uint)bVar12 * auVar81._24_4_ | (uint)!bVar12 * auVar93._24_4_;
            bVar12 = SUB81(uVar67 >> 7,0);
            auVar106._28_4_ = (uint)bVar12 * auVar81._28_4_ | (uint)!bVar12 * auVar93._28_4_;
            bVar12 = (bool)((byte)uVar67 & 1);
            auVar107._0_4_ = (float)((uint)bVar12 * auVar82._0_4_ | (uint)!bVar12 * auVar87._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar12 * auVar82._4_4_ | (uint)!bVar12 * auVar87._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar12 * auVar82._8_4_ | (uint)!bVar12 * auVar87._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar12 * auVar82._12_4_ | (uint)!bVar12 * auVar87._12_4_);
            bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar12 * auVar82._16_4_ | (uint)!bVar12 * auVar87._16_4_);
            bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar12 * auVar82._20_4_ | (uint)!bVar12 * auVar87._20_4_);
            bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar12 * auVar82._24_4_ | (uint)!bVar12 * auVar87._24_4_);
            bVar12 = SUB81(uVar67 >> 7,0);
            auVar107._28_4_ = (uint)bVar12 * auVar82._28_4_ | (uint)!bVar12 * auVar87._28_4_;
            auVar168._8_4_ = 0x80000000;
            auVar168._0_8_ = 0x8000000080000000;
            auVar168._12_4_ = 0x80000000;
            auVar168._16_4_ = 0x80000000;
            auVar168._20_4_ = 0x80000000;
            auVar168._24_4_ = 0x80000000;
            auVar168._28_4_ = 0x80000000;
            auVar94 = vxorps_avx512vl(auVar106,auVar168);
            auVar87 = auVar185._0_32_;
            auVar95 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar87);
            auVar18 = vfmadd231ps_fma(auVar95,auVar105,auVar105);
            auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar18));
            auVar179._8_4_ = 0xbf000000;
            auVar179._0_8_ = 0xbf000000bf000000;
            auVar179._12_4_ = 0xbf000000;
            auVar179._16_4_ = 0xbf000000;
            auVar179._20_4_ = 0xbf000000;
            auVar179._24_4_ = 0xbf000000;
            auVar179._28_4_ = 0xbf000000;
            fVar139 = auVar95._0_4_;
            fVar128 = auVar95._4_4_;
            fVar129 = auVar95._8_4_;
            fVar130 = auVar95._12_4_;
            fVar158 = auVar95._16_4_;
            fVar162 = auVar95._20_4_;
            fVar68 = auVar95._24_4_;
            auVar38._4_4_ = fVar128 * fVar128 * fVar128 * auVar18._4_4_ * -0.5;
            auVar38._0_4_ = fVar139 * fVar139 * fVar139 * auVar18._0_4_ * -0.5;
            auVar38._8_4_ = fVar129 * fVar129 * fVar129 * auVar18._8_4_ * -0.5;
            auVar38._12_4_ = fVar130 * fVar130 * fVar130 * auVar18._12_4_ * -0.5;
            auVar38._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
            auVar38._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar38._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
            auVar38._28_4_ = auVar105._28_4_;
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar95 = vfmadd231ps_avx512vl(auVar38,auVar93,auVar95);
            auVar39._4_4_ = auVar105._4_4_ * auVar95._4_4_;
            auVar39._0_4_ = auVar105._0_4_ * auVar95._0_4_;
            auVar39._8_4_ = auVar105._8_4_ * auVar95._8_4_;
            auVar39._12_4_ = auVar105._12_4_ * auVar95._12_4_;
            auVar39._16_4_ = auVar105._16_4_ * auVar95._16_4_;
            auVar39._20_4_ = auVar105._20_4_ * auVar95._20_4_;
            auVar39._24_4_ = auVar105._24_4_ * auVar95._24_4_;
            auVar39._28_4_ = 0;
            auVar40._4_4_ = auVar95._4_4_ * -auVar104._4_4_;
            auVar40._0_4_ = auVar95._0_4_ * -auVar104._0_4_;
            auVar40._8_4_ = auVar95._8_4_ * -auVar104._8_4_;
            auVar40._12_4_ = auVar95._12_4_ * -auVar104._12_4_;
            auVar40._16_4_ = auVar95._16_4_ * -auVar104._16_4_;
            auVar40._20_4_ = auVar95._20_4_ * -auVar104._20_4_;
            auVar40._24_4_ = auVar95._24_4_ * -auVar104._24_4_;
            auVar40._28_4_ = auVar105._28_4_;
            auVar92 = vmulps_avx512vl(auVar95,auVar87);
            auVar95 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar87);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,auVar107);
            auVar80 = vrsqrt14ps_avx512vl(auVar95);
            auVar95 = vmulps_avx512vl(auVar95,auVar179);
            fVar139 = auVar80._0_4_;
            fVar128 = auVar80._4_4_;
            fVar129 = auVar80._8_4_;
            fVar130 = auVar80._12_4_;
            fVar158 = auVar80._16_4_;
            fVar162 = auVar80._20_4_;
            fVar68 = auVar80._24_4_;
            auVar41._4_4_ = fVar128 * fVar128 * fVar128 * auVar95._4_4_;
            auVar41._0_4_ = fVar139 * fVar139 * fVar139 * auVar95._0_4_;
            auVar41._8_4_ = fVar129 * fVar129 * fVar129 * auVar95._8_4_;
            auVar41._12_4_ = fVar130 * fVar130 * fVar130 * auVar95._12_4_;
            auVar41._16_4_ = fVar158 * fVar158 * fVar158 * auVar95._16_4_;
            auVar41._20_4_ = fVar162 * fVar162 * fVar162 * auVar95._20_4_;
            auVar41._24_4_ = fVar68 * fVar68 * fVar68 * auVar95._24_4_;
            auVar41._28_4_ = auVar95._28_4_;
            auVar95 = vfmadd231ps_avx512vl(auVar41,auVar93,auVar80);
            auVar42._4_4_ = auVar107._4_4_ * auVar95._4_4_;
            auVar42._0_4_ = auVar107._0_4_ * auVar95._0_4_;
            auVar42._8_4_ = auVar107._8_4_ * auVar95._8_4_;
            auVar42._12_4_ = auVar107._12_4_ * auVar95._12_4_;
            auVar42._16_4_ = auVar107._16_4_ * auVar95._16_4_;
            auVar42._20_4_ = auVar107._20_4_ * auVar95._20_4_;
            auVar42._24_4_ = auVar107._24_4_ * auVar95._24_4_;
            auVar42._28_4_ = auVar80._28_4_;
            auVar43._4_4_ = auVar95._4_4_ * auVar94._4_4_;
            auVar43._0_4_ = auVar95._0_4_ * auVar94._0_4_;
            auVar43._8_4_ = auVar95._8_4_ * auVar94._8_4_;
            auVar43._12_4_ = auVar95._12_4_ * auVar94._12_4_;
            auVar43._16_4_ = auVar95._16_4_ * auVar94._16_4_;
            auVar43._20_4_ = auVar95._20_4_ * auVar94._20_4_;
            auVar43._24_4_ = auVar95._24_4_ * auVar94._24_4_;
            auVar43._28_4_ = auVar94._28_4_;
            auVar94 = vmulps_avx512vl(auVar95,auVar87);
            auVar18 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar74),auVar83);
            auVar95 = ZEXT1632(auVar74);
            auVar19 = vfmadd213ps_fma(auVar40,auVar95,auVar84);
            auVar93 = vfmadd213ps_avx512vl(auVar92,auVar95,auVar79);
            auVar80 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar72),auVar85);
            auVar76 = vfnmadd213ps_fma(auVar39,auVar95,auVar83);
            auVar91 = ZEXT1632(auVar72);
            auVar75 = vfmadd213ps_fma(auVar43,auVar91,auVar86);
            auVar23 = vfnmadd213ps_fma(auVar40,auVar95,auVar84);
            auVar20 = vfmadd213ps_fma(auVar94,auVar91,auVar78);
            auVar84 = ZEXT1632(auVar74);
            auVar70 = vfnmadd231ps_fma(auVar79,auVar84,auVar92);
            auVar73 = vfnmadd213ps_fma(auVar42,auVar91,auVar85);
            auVar71 = vfnmadd213ps_fma(auVar43,auVar91,auVar86);
            auVar77 = vfnmadd231ps_fma(auVar78,ZEXT1632(auVar72),auVar94);
            auVar78 = vsubps_avx512vl(auVar80,ZEXT1632(auVar76));
            auVar94 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar23));
            auVar95 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar70));
            auVar44._4_4_ = auVar94._4_4_ * auVar70._4_4_;
            auVar44._0_4_ = auVar94._0_4_ * auVar70._0_4_;
            auVar44._8_4_ = auVar94._8_4_ * auVar70._8_4_;
            auVar44._12_4_ = auVar94._12_4_ * auVar70._12_4_;
            auVar44._16_4_ = auVar94._16_4_ * 0.0;
            auVar44._20_4_ = auVar94._20_4_ * 0.0;
            auVar44._24_4_ = auVar94._24_4_ * 0.0;
            auVar44._28_4_ = auVar92._28_4_;
            auVar74 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar23),auVar95);
            auVar45._4_4_ = auVar95._4_4_ * auVar76._4_4_;
            auVar45._0_4_ = auVar95._0_4_ * auVar76._0_4_;
            auVar45._8_4_ = auVar95._8_4_ * auVar76._8_4_;
            auVar45._12_4_ = auVar95._12_4_ * auVar76._12_4_;
            auVar45._16_4_ = auVar95._16_4_ * 0.0;
            auVar45._20_4_ = auVar95._20_4_ * 0.0;
            auVar45._24_4_ = auVar95._24_4_ * 0.0;
            auVar45._28_4_ = auVar95._28_4_;
            auVar21 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar70),auVar78);
            auVar46._4_4_ = auVar23._4_4_ * auVar78._4_4_;
            auVar46._0_4_ = auVar23._0_4_ * auVar78._0_4_;
            auVar46._8_4_ = auVar23._8_4_ * auVar78._8_4_;
            auVar46._12_4_ = auVar23._12_4_ * auVar78._12_4_;
            auVar46._16_4_ = auVar78._16_4_ * 0.0;
            auVar46._20_4_ = auVar78._20_4_ * 0.0;
            auVar46._24_4_ = auVar78._24_4_ * 0.0;
            auVar46._28_4_ = auVar78._28_4_;
            auVar22 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar76),auVar94);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar87,ZEXT1632(auVar21));
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,ZEXT1632(auVar74));
            uVar67 = vcmpps_avx512vl(auVar94,auVar87,2);
            bVar60 = (byte)uVar67;
            fVar115 = (float)((uint)(bVar60 & 1) * auVar18._0_4_ |
                             (uint)!(bool)(bVar60 & 1) * auVar73._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            fVar117 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar73._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            fVar120 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar73._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            fVar121 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar73._12_4_);
            auVar91 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar120,CONCAT44(fVar117,fVar115))));
            fVar116 = (float)((uint)(bVar60 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar60 & 1) * auVar71._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            fVar119 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar71._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            fVar118 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar71._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            fVar122 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar71._12_4_);
            auVar81 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar118,CONCAT44(fVar119,fVar116))));
            auVar108._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar77._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar77._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar77._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar77._12_4_);
            fVar129 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar93._16_4_);
            auVar108._16_4_ = fVar129;
            fVar139 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar93._20_4_);
            auVar108._20_4_ = fVar139;
            fVar128 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar93._24_4_);
            auVar108._24_4_ = fVar128;
            iVar1 = (uint)(byte)(uVar67 >> 7) * auVar93._28_4_;
            auVar108._28_4_ = iVar1;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar80);
            auVar109._0_4_ =
                 (uint)(bVar60 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar74._0_4_;
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar74._4_4_;
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar74._8_4_;
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar74._12_4_;
            auVar109._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar94._16_4_;
            auVar109._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar94._20_4_;
            auVar109._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar94._24_4_;
            auVar109._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar23),ZEXT1632(auVar75));
            auVar110._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar18._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar18._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar18._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar18._12_4_);
            fVar162 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar94._16_4_);
            auVar110._16_4_ = fVar162;
            fVar158 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar94._20_4_);
            auVar110._20_4_ = fVar158;
            fVar130 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar94._24_4_);
            auVar110._24_4_ = fVar130;
            auVar110._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar20));
            auVar111._0_4_ =
                 (float)((uint)(bVar60 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar60 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar114 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar94._16_4_);
            auVar111._16_4_ = fVar114;
            fVar68 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar94._20_4_);
            auVar111._20_4_ = fVar68;
            fVar69 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar94._24_4_);
            auVar111._24_4_ = fVar69;
            iVar2 = (uint)(byte)(uVar67 >> 7) * auVar94._28_4_;
            auVar111._28_4_ = iVar2;
            auVar112._0_4_ =
                 (uint)(bVar60 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar80._0_4_
            ;
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar12 * (int)auVar76._4_4_ | (uint)!bVar12 * auVar80._4_4_;
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar12 * (int)auVar76._8_4_ | (uint)!bVar12 * auVar80._8_4_;
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar12 * (int)auVar76._12_4_ | (uint)!bVar12 * auVar80._12_4_;
            auVar112._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar80._16_4_;
            auVar112._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar80._20_4_;
            auVar112._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar80._24_4_;
            auVar112._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar80._28_4_;
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar80 = vsubps_avx512vl(auVar112,auVar91);
            auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar23._12_4_ |
                                                    (uint)!bVar16 * auVar75._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar23._8_4_ |
                                                             (uint)!bVar15 * auVar75._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar23._4_4_ |
                                                                      (uint)!bVar12 * auVar75._4_4_,
                                                                      (uint)(bVar60 & 1) *
                                                                      (int)auVar23._0_4_ |
                                                                      (uint)!(bool)(bVar60 & 1) *
                                                                      auVar75._0_4_)))),auVar81);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar70._12_4_ |
                                                    (uint)!bVar17 * auVar20._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar70._8_4_ |
                                                             (uint)!bVar14 * auVar20._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar70._4_4_ |
                                                                      (uint)!bVar13 * auVar20._4_4_,
                                                                      (uint)(bVar60 & 1) *
                                                                      (int)auVar70._0_4_ |
                                                                      (uint)!(bool)(bVar60 & 1) *
                                                                      auVar20._0_4_)))),auVar108);
            auVar92 = vsubps_avx(auVar91,auVar109);
            auVar78 = vsubps_avx(auVar81,auVar110);
            auVar79 = vsubps_avx(auVar108,auVar111);
            auVar47._4_4_ = auVar93._4_4_ * fVar117;
            auVar47._0_4_ = auVar93._0_4_ * fVar115;
            auVar47._8_4_ = auVar93._8_4_ * fVar120;
            auVar47._12_4_ = auVar93._12_4_ * fVar121;
            auVar47._16_4_ = auVar93._16_4_ * 0.0;
            auVar47._20_4_ = auVar93._20_4_ * 0.0;
            auVar47._24_4_ = auVar93._24_4_ * 0.0;
            auVar47._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar47,auVar108,auVar80);
            auVar148._0_4_ = fVar116 * auVar80._0_4_;
            auVar148._4_4_ = fVar119 * auVar80._4_4_;
            auVar148._8_4_ = fVar118 * auVar80._8_4_;
            auVar148._12_4_ = fVar122 * auVar80._12_4_;
            auVar148._16_4_ = auVar80._16_4_ * 0.0;
            auVar148._20_4_ = auVar80._20_4_ * 0.0;
            auVar148._24_4_ = auVar80._24_4_ * 0.0;
            auVar148._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar148,auVar91,auVar95);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar87,ZEXT1632(auVar74));
            auVar153._0_4_ = auVar95._0_4_ * auVar108._0_4_;
            auVar153._4_4_ = auVar95._4_4_ * auVar108._4_4_;
            auVar153._8_4_ = auVar95._8_4_ * auVar108._8_4_;
            auVar153._12_4_ = auVar95._12_4_ * auVar108._12_4_;
            auVar153._16_4_ = auVar95._16_4_ * fVar129;
            auVar153._20_4_ = auVar95._20_4_ * fVar139;
            auVar153._24_4_ = auVar95._24_4_ * fVar128;
            auVar153._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar153,auVar81,auVar93);
            auVar82 = vfmadd231ps_avx512vl(auVar94,auVar87,ZEXT1632(auVar74));
            auVar94 = vmulps_avx512vl(auVar79,auVar109);
            auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar111);
            auVar48._4_4_ = auVar78._4_4_ * auVar111._4_4_;
            auVar48._0_4_ = auVar78._0_4_ * auVar111._0_4_;
            auVar48._8_4_ = auVar78._8_4_ * auVar111._8_4_;
            auVar48._12_4_ = auVar78._12_4_ * auVar111._12_4_;
            auVar48._16_4_ = auVar78._16_4_ * fVar114;
            auVar48._20_4_ = auVar78._20_4_ * fVar68;
            auVar48._24_4_ = auVar78._24_4_ * fVar69;
            auVar48._28_4_ = iVar2;
            auVar74 = vfmsub231ps_fma(auVar48,auVar110,auVar79);
            auVar154._0_4_ = auVar110._0_4_ * auVar92._0_4_;
            auVar154._4_4_ = auVar110._4_4_ * auVar92._4_4_;
            auVar154._8_4_ = auVar110._8_4_ * auVar92._8_4_;
            auVar154._12_4_ = auVar110._12_4_ * auVar92._12_4_;
            auVar154._16_4_ = fVar162 * auVar92._16_4_;
            auVar154._20_4_ = fVar158 * auVar92._20_4_;
            auVar154._24_4_ = fVar130 * auVar92._24_4_;
            auVar154._28_4_ = 0;
            auVar18 = vfmsub231ps_fma(auVar154,auVar78,auVar109);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar87,auVar94);
            auVar83 = vfmadd231ps_avx512vl(auVar94,auVar87,ZEXT1632(auVar74));
            auVar94 = vmaxps_avx(auVar82,auVar83);
            uVar131 = vcmpps_avx512vl(auVar94,auVar87,2);
            bVar66 = bVar66 & (byte)uVar131;
            if (bVar66 != 0) {
              uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar175._4_4_ = uVar123;
              auVar175._0_4_ = uVar123;
              auVar175._8_4_ = uVar123;
              auVar175._12_4_ = uVar123;
              auVar175._16_4_ = uVar123;
              auVar175._20_4_ = uVar123;
              auVar175._24_4_ = uVar123;
              auVar175._28_4_ = uVar123;
              auVar190 = ZEXT3264(auVar175);
              auVar49._4_4_ = auVar79._4_4_ * auVar95._4_4_;
              auVar49._0_4_ = auVar79._0_4_ * auVar95._0_4_;
              auVar49._8_4_ = auVar79._8_4_ * auVar95._8_4_;
              auVar49._12_4_ = auVar79._12_4_ * auVar95._12_4_;
              auVar49._16_4_ = auVar79._16_4_ * auVar95._16_4_;
              auVar49._20_4_ = auVar79._20_4_ * auVar95._20_4_;
              auVar49._24_4_ = auVar79._24_4_ * auVar95._24_4_;
              auVar49._28_4_ = auVar94._28_4_;
              auVar19 = vfmsub231ps_fma(auVar49,auVar78,auVar93);
              auVar50._4_4_ = auVar93._4_4_ * auVar92._4_4_;
              auVar50._0_4_ = auVar93._0_4_ * auVar92._0_4_;
              auVar50._8_4_ = auVar93._8_4_ * auVar92._8_4_;
              auVar50._12_4_ = auVar93._12_4_ * auVar92._12_4_;
              auVar50._16_4_ = auVar93._16_4_ * auVar92._16_4_;
              auVar50._20_4_ = auVar93._20_4_ * auVar92._20_4_;
              auVar50._24_4_ = auVar93._24_4_ * auVar92._24_4_;
              auVar50._28_4_ = auVar93._28_4_;
              auVar18 = vfmsub231ps_fma(auVar50,auVar80,auVar79);
              auVar51._4_4_ = auVar78._4_4_ * auVar80._4_4_;
              auVar51._0_4_ = auVar78._0_4_ * auVar80._0_4_;
              auVar51._8_4_ = auVar78._8_4_ * auVar80._8_4_;
              auVar51._12_4_ = auVar78._12_4_ * auVar80._12_4_;
              auVar51._16_4_ = auVar78._16_4_ * auVar80._16_4_;
              auVar51._20_4_ = auVar78._20_4_ * auVar80._20_4_;
              auVar51._24_4_ = auVar78._24_4_ * auVar80._24_4_;
              auVar51._28_4_ = auVar78._28_4_;
              auVar75 = vfmsub231ps_fma(auVar51,auVar92,auVar95);
              auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar75));
              auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar19),auVar87);
              auVar95 = vrcp14ps_avx512vl(auVar94);
              auVar92 = auVar182._0_32_;
              auVar93 = vfnmadd213ps_avx512vl(auVar95,auVar94,auVar92);
              auVar74 = vfmadd132ps_fma(auVar93,auVar95,auVar95);
              auVar52._4_4_ = auVar75._4_4_ * auVar108._4_4_;
              auVar52._0_4_ = auVar75._0_4_ * auVar108._0_4_;
              auVar52._8_4_ = auVar75._8_4_ * auVar108._8_4_;
              auVar52._12_4_ = auVar75._12_4_ * auVar108._12_4_;
              auVar52._16_4_ = fVar129 * 0.0;
              auVar52._20_4_ = fVar139 * 0.0;
              auVar52._24_4_ = fVar128 * 0.0;
              auVar52._28_4_ = iVar1;
              auVar18 = vfmadd231ps_fma(auVar52,auVar81,ZEXT1632(auVar18));
              auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar91,ZEXT1632(auVar19));
              fVar139 = auVar74._0_4_;
              fVar128 = auVar74._4_4_;
              fVar129 = auVar74._8_4_;
              fVar130 = auVar74._12_4_;
              local_240 = ZEXT1632(CONCAT412(auVar18._12_4_ * fVar130,
                                             CONCAT48(auVar18._8_4_ * fVar129,
                                                      CONCAT44(auVar18._4_4_ * fVar128,
                                                               auVar18._0_4_ * fVar139))));
              uVar131 = vcmpps_avx512vl(local_240,auVar175,2);
              auVar59._4_4_ = uStack_37c;
              auVar59._0_4_ = local_380;
              auVar59._8_4_ = uStack_378;
              auVar59._12_4_ = uStack_374;
              auVar59._16_4_ = uStack_370;
              auVar59._20_4_ = uStack_36c;
              auVar59._24_4_ = uStack_368;
              auVar59._28_4_ = uStack_364;
              uVar24 = vcmpps_avx512vl(local_240,auVar59,0xd);
              bVar66 = (byte)uVar131 & (byte)uVar24 & bVar66;
              if (bVar66 != 0) {
                uVar131 = vcmpps_avx512vl(auVar94,auVar87,4);
                bVar66 = bVar66 & (byte)uVar131;
                auVar176 = ZEXT1664(local_5e0);
                auVar180 = ZEXT3264(local_560);
                auVar181 = ZEXT3264(local_520);
                if (bVar66 != 0) {
                  fVar158 = auVar82._0_4_ * fVar139;
                  fVar162 = auVar82._4_4_ * fVar128;
                  auVar53._4_4_ = fVar162;
                  auVar53._0_4_ = fVar158;
                  fVar68 = auVar82._8_4_ * fVar129;
                  auVar53._8_4_ = fVar68;
                  fVar69 = auVar82._12_4_ * fVar130;
                  auVar53._12_4_ = fVar69;
                  fVar114 = auVar82._16_4_ * 0.0;
                  auVar53._16_4_ = fVar114;
                  fVar115 = auVar82._20_4_ * 0.0;
                  auVar53._20_4_ = fVar115;
                  fVar116 = auVar82._24_4_ * 0.0;
                  auVar53._24_4_ = fVar116;
                  auVar53._28_4_ = auVar94._28_4_;
                  auVar95 = vsubps_avx512vl(auVar92,auVar53);
                  local_280._0_4_ =
                       (float)((uint)(bVar60 & 1) * (int)fVar158 |
                              (uint)!(bool)(bVar60 & 1) * auVar95._0_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                  local_280._4_4_ =
                       (float)((uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar95._4_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                  local_280._8_4_ =
                       (float)((uint)bVar12 * (int)fVar68 | (uint)!bVar12 * auVar95._8_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                  local_280._12_4_ =
                       (float)((uint)bVar12 * (int)fVar69 | (uint)!bVar12 * auVar95._12_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                  local_280._16_4_ =
                       (float)((uint)bVar12 * (int)fVar114 | (uint)!bVar12 * auVar95._16_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                  local_280._20_4_ =
                       (float)((uint)bVar12 * (int)fVar115 | (uint)!bVar12 * auVar95._20_4_);
                  bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                  local_280._24_4_ =
                       (float)((uint)bVar12 * (int)fVar116 | (uint)!bVar12 * auVar95._24_4_);
                  bVar12 = SUB81(uVar67 >> 7,0);
                  local_280._28_4_ =
                       (float)((uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar95._28_4_);
                  auVar94 = vsubps_avx(ZEXT1632(auVar72),auVar84);
                  auVar74 = vfmadd213ps_fma(auVar94,local_280,auVar84);
                  uVar123 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                  auVar29._4_4_ = uVar123;
                  auVar29._0_4_ = uVar123;
                  auVar29._8_4_ = uVar123;
                  auVar29._12_4_ = uVar123;
                  auVar29._16_4_ = uVar123;
                  auVar29._20_4_ = uVar123;
                  auVar29._24_4_ = uVar123;
                  auVar29._28_4_ = uVar123;
                  auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                               CONCAT48(auVar74._8_4_ +
                                                                        auVar74._8_4_,
                                                                        CONCAT44(auVar74._4_4_ +
                                                                                 auVar74._4_4_,
                                                                                 auVar74._0_4_ +
                                                                                 auVar74._0_4_)))),
                                            auVar29);
                  uVar131 = vcmpps_avx512vl(local_240,auVar94,6);
                  if (((byte)uVar131 & bVar66) != 0) {
                    auVar134._0_4_ = auVar83._0_4_ * fVar139;
                    auVar134._4_4_ = auVar83._4_4_ * fVar128;
                    auVar134._8_4_ = auVar83._8_4_ * fVar129;
                    auVar134._12_4_ = auVar83._12_4_ * fVar130;
                    auVar134._16_4_ = auVar83._16_4_ * 0.0;
                    auVar134._20_4_ = auVar83._20_4_ * 0.0;
                    auVar134._24_4_ = auVar83._24_4_ * 0.0;
                    auVar134._28_4_ = 0;
                    auVar94 = vsubps_avx512vl(auVar92,auVar134);
                    auVar113._0_4_ =
                         (uint)(bVar60 & 1) * (int)auVar134._0_4_ |
                         (uint)!(bool)(bVar60 & 1) * auVar94._0_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                    auVar113._4_4_ =
                         (uint)bVar12 * (int)auVar134._4_4_ | (uint)!bVar12 * auVar94._4_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                    auVar113._8_4_ =
                         (uint)bVar12 * (int)auVar134._8_4_ | (uint)!bVar12 * auVar94._8_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                    auVar113._12_4_ =
                         (uint)bVar12 * (int)auVar134._12_4_ | (uint)!bVar12 * auVar94._12_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                    auVar113._16_4_ =
                         (uint)bVar12 * (int)auVar134._16_4_ | (uint)!bVar12 * auVar94._16_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                    auVar113._20_4_ =
                         (uint)bVar12 * (int)auVar134._20_4_ | (uint)!bVar12 * auVar94._20_4_;
                    bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                    auVar113._24_4_ =
                         (uint)bVar12 * (int)auVar134._24_4_ | (uint)!bVar12 * auVar94._24_4_;
                    auVar113._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar94._28_4_;
                    auVar30._8_4_ = 0x40000000;
                    auVar30._0_8_ = 0x4000000040000000;
                    auVar30._12_4_ = 0x40000000;
                    auVar30._16_4_ = 0x40000000;
                    auVar30._20_4_ = 0x40000000;
                    auVar30._24_4_ = 0x40000000;
                    auVar30._28_4_ = 0x40000000;
                    local_260 = vfmsub132ps_avx512vl(auVar113,auVar92,auVar30);
                    local_220 = (undefined4)lVar63;
                    local_210 = local_5e0;
                    local_200 = local_5c0;
                    uStack_1f8 = uStack_5b8;
                    local_1f0 = local_5d0;
                    uStack_1e8 = uStack_5c8;
                    pGVar10 = (context->scene->geometries).items[local_5e8].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar60 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar60 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar74 = vcvtsi2ss_avx512f(auVar182._0_16_,local_220);
                      fVar139 = auVar74._0_4_;
                      local_1c0[0] = (fVar139 + local_280._0_4_ + 0.0) * (float)local_2c0;
                      local_1c0[1] = (fVar139 + local_280._4_4_ + 1.0) * local_2c0._4_4_;
                      local_1c0[2] = (fVar139 + local_280._8_4_ + 2.0) * fStack_2b8;
                      local_1c0[3] = (fVar139 + local_280._12_4_ + 3.0) * fStack_2b4;
                      fStack_1b0 = (fVar139 + local_280._16_4_ + 4.0) * fStack_2b0;
                      fStack_1ac = (fVar139 + local_280._20_4_ + 5.0) * fStack_2ac;
                      fStack_1a8 = (fVar139 + local_280._24_4_ + 6.0) * fStack_2a8;
                      fStack_1a4 = fVar139 + local_280._28_4_ + 7.0;
                      local_1a0 = local_260;
                      local_180 = local_240;
                      uVar67 = CONCAT71(0,(byte)uVar131 & bVar66);
                      local_460._0_8_ = uVar67;
                      lVar26 = 0;
                      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_5a0._0_8_ = lVar26;
                      local_160 = auVar175;
                      local_5b0._0_8_ = pGVar10;
                      local_21c = iVar9;
                      do {
                        auVar75 = auVar185._0_16_;
                        fVar139 = local_1c0[local_5a0._0_8_];
                        local_320._4_4_ = fVar139;
                        local_320._0_4_ = fVar139;
                        local_320._8_4_ = fVar139;
                        local_320._12_4_ = fVar139;
                        local_310 = *(undefined4 *)(local_1a0 + local_5a0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + local_5a0._0_8_ * 4);
                        local_590.context = context->user;
                        fVar128 = 1.0 - fVar139;
                        auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar139 * (fVar128 + fVar128))),
                                                   ZEXT416((uint)fVar128),ZEXT416((uint)fVar128));
                        auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_320,
                                                  ZEXT416(0xc0a00000));
                        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139 * 3.0)),
                                                  ZEXT416((uint)(fVar139 + fVar139)),auVar74);
                        auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_320,
                                                  ZEXT416(0x40000000));
                        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128 * -3.0)),
                                                  ZEXT416((uint)(fVar128 + fVar128)),auVar74);
                        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar139 * fVar139)),local_320,
                                                  ZEXT416((uint)(fVar128 * -2.0)));
                        fVar139 = auVar19._0_4_ * 0.5;
                        fVar128 = auVar72._0_4_ * 0.5;
                        fVar129 = auVar74._0_4_ * 0.5;
                        fVar130 = auVar18._0_4_ * 0.5;
                        auVar146._0_4_ = fVar130 * local_480;
                        auVar146._4_4_ = fVar130 * fStack_47c;
                        auVar146._8_4_ = fVar130 * fStack_478;
                        auVar146._12_4_ = fVar130 * fStack_474;
                        auVar157._4_4_ = fVar129;
                        auVar157._0_4_ = fVar129;
                        auVar157._8_4_ = fVar129;
                        auVar157._12_4_ = fVar129;
                        auVar55._8_8_ = uStack_5c8;
                        auVar55._0_8_ = local_5d0;
                        auVar74 = vfmadd132ps_fma(auVar157,auVar146,auVar55);
                        auVar147._4_4_ = fVar128;
                        auVar147._0_4_ = fVar128;
                        auVar147._8_4_ = fVar128;
                        auVar147._12_4_ = fVar128;
                        auVar57._8_8_ = uStack_5b8;
                        auVar57._0_8_ = local_5c0;
                        auVar74 = vfmadd132ps_fma(auVar147,auVar74,auVar57);
                        auVar127._4_4_ = fVar139;
                        auVar127._0_4_ = fVar139;
                        auVar127._8_4_ = fVar139;
                        auVar127._12_4_ = fVar139;
                        auVar74 = vfmadd213ps_fma(auVar127,auVar176._0_16_,auVar74);
                        local_350 = auVar74._0_4_;
                        local_340 = vshufps_avx(auVar74,auVar74,0x55);
                        local_330 = vshufps_avx(auVar74,auVar74,0xaa);
                        local_300 = local_530._0_8_;
                        uStack_2f8 = local_530._8_8_;
                        local_2f0 = local_540;
                        vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                        uStack_2dc = (local_590.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_590.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_600 = local_390;
                        local_590.valid = (int *)local_600;
                        local_590.geometryUserPtr = *(void **)(local_5b0._0_8_ + 0x18);
                        local_590.hit = (RTCHitN *)&local_350;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (*(code **)(local_5b0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_5b0._0_8_ + 0x48))(&local_590);
                          auVar190 = ZEXT3264(local_160);
                          auVar187 = ZEXT3264(local_420);
                          auVar181 = ZEXT3264(local_520);
                          auVar180 = ZEXT3264(local_560);
                          auVar184 = ZEXT3264(local_3e0);
                          auVar183 = ZEXT3264(local_400);
                          auVar176 = ZEXT1664(local_5e0);
                          auVar74 = vxorps_avx512vl(auVar75,auVar75);
                          auVar185 = ZEXT1664(auVar74);
                        }
                        auVar74 = auVar185._0_16_;
                        uVar67 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar67 & 0xf) == 0) {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar182 = ZEXT3264(auVar94);
                          auVar186 = ZEXT3264(local_4c0);
                          auVar188 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_5b0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var11)(&local_590);
                            auVar190 = ZEXT3264(local_160);
                            auVar187 = ZEXT3264(local_420);
                            auVar181 = ZEXT3264(local_520);
                            auVar180 = ZEXT3264(local_560);
                            auVar184 = ZEXT3264(local_3e0);
                            auVar183 = ZEXT3264(local_400);
                            auVar176 = ZEXT1664(local_5e0);
                            auVar74 = vxorps_avx512vl(auVar74,auVar74);
                            auVar185 = ZEXT1664(auVar74);
                          }
                          uVar67 = vptestmd_avx512vl(local_600,local_600);
                          uVar67 = uVar67 & 0xf;
                          auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar67 & 1);
                          bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                          bVar14 = SUB81(uVar67 >> 3,0);
                          *(uint *)(local_590.ray + 0x80) =
                               (uint)bVar12 * auVar74._0_4_ |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                          *(uint *)(local_590.ray + 0x84) =
                               (uint)bVar13 * auVar74._4_4_ |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                          *(uint *)(local_590.ray + 0x88) =
                               (uint)bVar15 * auVar74._8_4_ |
                               (uint)!bVar15 * *(int *)(local_590.ray + 0x88);
                          *(uint *)(local_590.ray + 0x8c) =
                               (uint)bVar14 * auVar74._12_4_ |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x8c);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar182 = ZEXT3264(auVar94);
                          auVar186 = ZEXT3264(local_4c0);
                          auVar188 = ZEXT3264(local_4e0);
                          auVar189 = ZEXT3264(local_500);
                          if ((byte)uVar67 != 0) {
                            bVar60 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar190._0_4_;
                        local_460._0_8_ = local_460._0_8_ ^ 1L << (local_5a0._0_8_ & 0x3f);
                        bVar60 = 0;
                        lVar26 = 0;
                        for (uVar67 = local_460._0_8_; (uVar67 & 1) == 0;
                            uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                          lVar26 = lVar26 + 1;
                        }
                        local_5a0._0_8_ = lVar26;
                      } while (local_460._0_8_ != 0);
                    }
                    bVar62 = (bool)(bVar62 | bVar60);
                  }
                }
                goto LAB_01ad441d;
              }
            }
            auVar180 = ZEXT3264(local_560);
            auVar181 = ZEXT3264(local_520);
          }
LAB_01ad441d:
          lVar63 = lVar63 + 8;
        } while ((int)lVar63 < iVar9);
      }
      if (bVar62) {
        return bVar62;
      }
      uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar27._4_4_ = uVar123;
      auVar27._0_4_ = uVar123;
      auVar27._8_4_ = uVar123;
      auVar27._12_4_ = uVar123;
      uVar131 = vcmpps_avx512vl(local_290,auVar27,2);
      uVar64 = (uint)uVar65 & (uint)uVar131;
      uVar65 = (ulong)uVar64;
    } while (uVar64 != 0);
  }
  return bVar62;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }